

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  byte bVar71;
  long lVar72;
  uint uVar73;
  long lVar74;
  bool bVar75;
  float fVar76;
  float fVar113;
  float fVar114;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar115;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar124 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar125 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar196;
  float fVar197;
  vint4 bi;
  undefined1 auVar181 [16];
  float fVar198;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar199;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  float fVar200;
  float fVar201;
  float fVar225;
  float fVar227;
  vint4 ai_2;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar229;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar226;
  float fVar228;
  float fVar230;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar231;
  float fVar249;
  float fVar250;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar251;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  vint4 ai;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar262 [64];
  vint4 ai_1;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  float fVar293;
  float fVar302;
  float fVar303;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar304;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar307 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [64];
  float fVar314;
  float fVar315;
  float fVar322;
  float fVar324;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar321 [64];
  float fVar328;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [64];
  float fVar338;
  float fVar344;
  float fVar345;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar346;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [64];
  vfloat4 a0;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar355;
  float fVar360;
  float fVar361;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar362;
  undefined1 auVar359 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  int local_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 auStack_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float fStack_420;
  ulong local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 auStack_2f8 [16];
  ulong local_2e8;
  Primitive *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  uint auStack_2a8 [4];
  undefined8 local_298;
  undefined4 local_290;
  undefined8 local_28c;
  undefined4 local_284;
  undefined4 local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  float afStack_1b8 [8];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar70;
  undefined1 auVar261 [32];
  undefined1 auVar354 [32];
  
  PVar12 = prim[1];
  uVar68 = (ulong)(byte)PVar12;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  lVar74 = uVar68 * 0x25;
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x11 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  fVar200 = *(float *)(prim + lVar74 + 0x12);
  auVar162 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar232._0_4_ = fVar200 * auVar162._0_4_;
  auVar232._4_4_ = fVar200 * auVar162._4_4_;
  auVar232._8_4_ = fVar200 * auVar162._8_4_;
  auVar232._12_4_ = fVar200 * auVar162._12_4_;
  auVar339._0_4_ = fVar200 * (ray->dir).field_0.m128[0];
  auVar339._4_4_ = fVar200 * (ray->dir).field_0.m128[1];
  auVar339._8_4_ = fVar200 * (ray->dir).field_0.m128[2];
  auVar339._12_4_ = fVar200 * (ray->dir).field_0.m128[3];
  auVar162 = vcvtdq2ps_avx(auVar189);
  auVar128 = vcvtdq2ps_avx(auVar176);
  auVar263 = vcvtdq2ps_avx(auVar127);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar189 = vshufps_avx(auVar339,auVar339,0x55);
  auVar176 = vshufps_avx(auVar339,auVar339,0xaa);
  fVar180 = auVar176._0_4_;
  fVar196 = auVar176._4_4_;
  fVar197 = auVar176._8_4_;
  fVar198 = auVar176._12_4_;
  fVar200 = auVar189._0_4_;
  fVar225 = auVar189._4_4_;
  fVar227 = auVar189._8_4_;
  fVar229 = auVar189._12_4_;
  auVar19 = vcvtdq2ps_avx(auVar96);
  auVar331 = vcvtdq2ps_avx(auVar139);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar96 = vshufps_avx(auVar339,auVar339,0);
  fVar231 = auVar96._0_4_;
  fVar249 = auVar96._4_4_;
  fVar250 = auVar96._8_4_;
  fVar251 = auVar96._12_4_;
  auVar340._0_4_ = auVar162._0_4_ * fVar200 + fVar180 * auVar128._0_4_ + auVar19._0_4_ * fVar231;
  auVar340._4_4_ = auVar162._4_4_ * fVar225 + fVar196 * auVar128._4_4_ + auVar19._4_4_ * fVar249;
  auVar340._8_4_ = auVar162._8_4_ * fVar227 + fVar197 * auVar128._8_4_ + auVar19._8_4_ * fVar250;
  auVar340._12_4_ = auVar162._12_4_ * fVar229 + fVar198 * auVar128._12_4_ + auVar19._12_4_ * fVar251
  ;
  auVar356._0_4_ = fVar231 * auVar331._0_4_ + fVar180 * auVar20._0_4_ + fVar200 * auVar263._0_4_;
  auVar356._4_4_ = fVar249 * auVar331._4_4_ + fVar196 * auVar20._4_4_ + fVar225 * auVar263._4_4_;
  auVar356._8_4_ = fVar250 * auVar331._8_4_ + fVar197 * auVar20._8_4_ + fVar227 * auVar263._8_4_;
  auVar356._12_4_ = fVar251 * auVar331._12_4_ + fVar198 * auVar20._12_4_ + fVar229 * auVar263._12_4_
  ;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar156 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar79);
  auVar181._0_4_ = fVar180 * auVar78._0_4_ + fVar200 * auVar21._0_4_ + fVar231 * auVar96._0_4_;
  auVar181._4_4_ = fVar196 * auVar78._4_4_ + fVar225 * auVar21._4_4_ + fVar249 * auVar96._4_4_;
  auVar181._8_4_ = fVar197 * auVar78._8_4_ + fVar227 * auVar21._8_4_ + fVar250 * auVar96._8_4_;
  auVar181._12_4_ = fVar198 * auVar78._12_4_ + fVar229 * auVar21._12_4_ + fVar251 * auVar96._12_4_;
  auVar189 = vshufps_avx(auVar232,auVar232,0xaa);
  fVar200 = auVar189._0_4_;
  fVar225 = auVar189._4_4_;
  fVar227 = auVar189._8_4_;
  fVar229 = auVar189._12_4_;
  auVar189 = vshufps_avx(auVar232,auVar232,0x55);
  fVar180 = auVar189._0_4_;
  fVar196 = auVar189._4_4_;
  fVar197 = auVar189._8_4_;
  fVar198 = auVar189._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar79 = vpmovsxwd_avx(auVar189);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar182 = vpmovsxwd_avx(auVar176);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar139 = vpmovsxwd_avx(auVar139);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar127 = vpmovsxwd_avx(auVar127);
  auVar189 = vshufps_avx(auVar232,auVar232,0);
  fVar231 = auVar189._0_4_;
  fVar249 = auVar189._4_4_;
  fVar250 = auVar189._8_4_;
  fVar251 = auVar189._12_4_;
  auVar347._0_4_ = fVar180 * auVar162._0_4_ + auVar128._0_4_ * fVar200 + auVar19._0_4_ * fVar231;
  auVar347._4_4_ = fVar196 * auVar162._4_4_ + auVar128._4_4_ * fVar225 + auVar19._4_4_ * fVar249;
  auVar347._8_4_ = fVar197 * auVar162._8_4_ + auVar128._8_4_ * fVar227 + auVar19._8_4_ * fVar250;
  auVar347._12_4_ = fVar198 * auVar162._12_4_ + auVar128._12_4_ * fVar229 + auVar19._12_4_ * fVar251
  ;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar68 * 0x16 + 6);
  auVar162 = vpmovsxwd_avx(auVar162);
  auVar149._0_4_ = fVar231 * auVar331._0_4_ + auVar20._0_4_ * fVar200 + fVar180 * auVar263._0_4_;
  auVar149._4_4_ = fVar249 * auVar331._4_4_ + auVar20._4_4_ * fVar225 + fVar196 * auVar263._4_4_;
  auVar149._8_4_ = fVar250 * auVar331._8_4_ + auVar20._8_4_ * fVar227 + fVar197 * auVar263._8_4_;
  auVar149._12_4_ = fVar251 * auVar331._12_4_ + auVar20._12_4_ * fVar229 + fVar198 * auVar263._12_4_
  ;
  auVar77._0_4_ = fVar231 * auVar96._0_4_ + fVar180 * auVar21._0_4_ + auVar78._0_4_ * fVar200;
  auVar77._4_4_ = fVar249 * auVar96._4_4_ + fVar196 * auVar21._4_4_ + auVar78._4_4_ * fVar225;
  auVar77._8_4_ = fVar250 * auVar96._8_4_ + fVar197 * auVar21._8_4_ + auVar78._8_4_ * fVar227;
  auVar77._12_4_ = fVar251 * auVar96._12_4_ + fVar198 * auVar21._12_4_ + auVar78._12_4_ * fVar229;
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar340,auVar252);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar202,1);
  auVar189 = vblendvps_avx(auVar340,auVar202,auVar96);
  auVar96 = vandps_avx(auVar356,auVar252);
  auVar96 = vcmpps_avx(auVar96,auVar202,1);
  auVar176 = vblendvps_avx(auVar356,auVar202,auVar96);
  auVar96 = vandps_avx(auVar181,auVar252);
  auVar96 = vcmpps_avx(auVar96,auVar202,1);
  auVar96 = vblendvps_avx(auVar181,auVar202,auVar96);
  auVar128 = vrcpps_avx(auVar189);
  fVar180 = auVar128._0_4_;
  auVar116._0_4_ = fVar180 * auVar189._0_4_;
  fVar196 = auVar128._4_4_;
  auVar116._4_4_ = fVar196 * auVar189._4_4_;
  fVar197 = auVar128._8_4_;
  auVar116._8_4_ = fVar197 * auVar189._8_4_;
  fVar198 = auVar128._12_4_;
  auVar116._12_4_ = fVar198 * auVar189._12_4_;
  auVar275._8_4_ = 0x3f800000;
  auVar275._0_8_ = 0x3f8000003f800000;
  auVar275._12_4_ = 0x3f800000;
  auVar189 = vsubps_avx(auVar275,auVar116);
  fVar180 = fVar180 + fVar180 * auVar189._0_4_;
  fVar196 = fVar196 + fVar196 * auVar189._4_4_;
  fVar197 = fVar197 + fVar197 * auVar189._8_4_;
  fVar198 = fVar198 + fVar198 * auVar189._12_4_;
  auVar189 = vrcpps_avx(auVar176);
  fVar200 = auVar189._0_4_;
  auVar203._0_4_ = fVar200 * auVar176._0_4_;
  fVar225 = auVar189._4_4_;
  auVar203._4_4_ = fVar225 * auVar176._4_4_;
  fVar227 = auVar189._8_4_;
  auVar203._8_4_ = fVar227 * auVar176._8_4_;
  fVar229 = auVar189._12_4_;
  auVar203._12_4_ = fVar229 * auVar176._12_4_;
  auVar189 = vsubps_avx(auVar275,auVar203);
  fVar200 = fVar200 + fVar200 * auVar189._0_4_;
  fVar225 = fVar225 + fVar225 * auVar189._4_4_;
  fVar227 = fVar227 + fVar227 * auVar189._8_4_;
  fVar229 = fVar229 + fVar229 * auVar189._12_4_;
  auVar189 = vrcpps_avx(auVar96);
  fVar231 = auVar189._0_4_;
  auVar233._0_4_ = fVar231 * auVar96._0_4_;
  fVar249 = auVar189._4_4_;
  auVar233._4_4_ = fVar249 * auVar96._4_4_;
  fVar250 = auVar189._8_4_;
  auVar233._8_4_ = fVar250 * auVar96._8_4_;
  fVar251 = auVar189._12_4_;
  auVar233._12_4_ = fVar251 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar275,auVar233);
  fVar231 = fVar231 + fVar231 * auVar96._0_4_;
  fVar249 = fVar249 + fVar249 * auVar96._4_4_;
  fVar250 = fVar250 + fVar250 * auVar96._8_4_;
  fVar251 = fVar251 + fVar251 * auVar96._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar176 = vpmovsxwd_avx(auVar128);
  auVar128 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                          *(float *)(prim + lVar74 + 0x16)) *
                                         *(float *)(prim + lVar74 + 0x1a))),0);
  auVar96 = vcvtdq2ps_avx(auVar156);
  auVar189 = vcvtdq2ps_avx(auVar79);
  auVar189 = vsubps_avx(auVar189,auVar96);
  fVar199 = auVar128._0_4_;
  fVar201 = auVar128._4_4_;
  fVar226 = auVar128._8_4_;
  fVar228 = auVar128._12_4_;
  auVar253._0_4_ = fVar199 * auVar189._0_4_ + auVar96._0_4_;
  auVar253._4_4_ = fVar201 * auVar189._4_4_ + auVar96._4_4_;
  auVar253._8_4_ = fVar226 * auVar189._8_4_ + auVar96._8_4_;
  auVar253._12_4_ = fVar228 * auVar189._12_4_ + auVar96._12_4_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar128 = vpmovsxwd_avx(auVar263);
  auVar96 = vcvtdq2ps_avx(auVar182);
  auVar189 = vcvtdq2ps_avx(auVar139);
  auVar189 = vsubps_avx(auVar189,auVar96);
  auVar264._0_4_ = fVar199 * auVar189._0_4_ + auVar96._0_4_;
  auVar264._4_4_ = fVar201 * auVar189._4_4_ + auVar96._4_4_;
  auVar264._8_4_ = fVar226 * auVar189._8_4_ + auVar96._8_4_;
  auVar264._12_4_ = fVar228 * auVar189._12_4_ + auVar96._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar139 = vpmovsxwd_avx(auVar20);
  auVar96 = vcvtdq2ps_avx(auVar127);
  auVar189 = vcvtdq2ps_avx(auVar162);
  auVar189 = vsubps_avx(auVar189,auVar96);
  auVar276._0_4_ = fVar199 * auVar189._0_4_ + auVar96._0_4_;
  auVar276._4_4_ = fVar201 * auVar189._4_4_ + auVar96._4_4_;
  auVar276._8_4_ = fVar226 * auVar189._8_4_ + auVar96._8_4_;
  auVar276._12_4_ = fVar228 * auVar189._12_4_ + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar176);
  auVar189 = vcvtdq2ps_avx(auVar128);
  auVar189 = vsubps_avx(auVar189,auVar96);
  auVar294._0_4_ = fVar199 * auVar189._0_4_ + auVar96._0_4_;
  auVar294._4_4_ = fVar201 * auVar189._4_4_ + auVar96._4_4_;
  auVar294._8_4_ = fVar226 * auVar189._8_4_ + auVar96._8_4_;
  auVar294._12_4_ = fVar228 * auVar189._12_4_ + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar139);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 0x21 + 6);
  auVar189 = vpmovsxwd_avx(auVar19);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar189 = vsubps_avx(auVar189,auVar96);
  auVar305._0_4_ = fVar199 * auVar189._0_4_ + auVar96._0_4_;
  auVar305._4_4_ = fVar201 * auVar189._4_4_ + auVar96._4_4_;
  auVar305._8_4_ = fVar226 * auVar189._8_4_ + auVar96._8_4_;
  auVar305._12_4_ = fVar228 * auVar189._12_4_ + auVar96._12_4_;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = *(ulong *)(prim + uVar68 * 0x1f + 6);
  auVar96 = vpmovsxwd_avx(auVar331);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar189 = vpmovsxwd_avx(auVar21);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar189 = vsubps_avx(auVar189,auVar96);
  auVar316._0_4_ = fVar199 * auVar189._0_4_ + auVar96._0_4_;
  auVar316._4_4_ = fVar201 * auVar189._4_4_ + auVar96._4_4_;
  auVar316._8_4_ = fVar226 * auVar189._8_4_ + auVar96._8_4_;
  auVar316._12_4_ = fVar228 * auVar189._12_4_ + auVar96._12_4_;
  auVar96 = vsubps_avx(auVar253,auVar347);
  auVar254._0_4_ = fVar180 * auVar96._0_4_;
  auVar254._4_4_ = fVar196 * auVar96._4_4_;
  auVar254._8_4_ = fVar197 * auVar96._8_4_;
  auVar254._12_4_ = fVar198 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar264,auVar347);
  auVar182._0_4_ = fVar180 * auVar96._0_4_;
  auVar182._4_4_ = fVar196 * auVar96._4_4_;
  auVar182._8_4_ = fVar197 * auVar96._8_4_;
  auVar182._12_4_ = fVar198 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar276,auVar149);
  auVar265._0_4_ = fVar200 * auVar96._0_4_;
  auVar265._4_4_ = fVar225 * auVar96._4_4_;
  auVar265._8_4_ = fVar227 * auVar96._8_4_;
  auVar265._12_4_ = fVar229 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar294,auVar149);
  auVar156._0_4_ = fVar200 * auVar96._0_4_;
  auVar156._4_4_ = fVar225 * auVar96._4_4_;
  auVar156._8_4_ = fVar227 * auVar96._8_4_;
  auVar156._12_4_ = fVar229 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar305,auVar77);
  auVar204._0_4_ = fVar231 * auVar96._0_4_;
  auVar204._4_4_ = fVar249 * auVar96._4_4_;
  auVar204._8_4_ = fVar250 * auVar96._8_4_;
  auVar204._12_4_ = fVar251 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar316,auVar77);
  auVar78._0_4_ = fVar231 * auVar96._0_4_;
  auVar78._4_4_ = fVar249 * auVar96._4_4_;
  auVar78._8_4_ = fVar250 * auVar96._8_4_;
  auVar78._12_4_ = fVar251 * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar254,auVar182);
  auVar189 = vpminsd_avx(auVar265,auVar156);
  auVar96 = vmaxps_avx(auVar96,auVar189);
  auVar189 = vpminsd_avx(auVar204,auVar78);
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar295._4_4_ = uVar8;
  auVar295._0_4_ = uVar8;
  auVar295._8_4_ = uVar8;
  auVar295._12_4_ = uVar8;
  auVar189 = vmaxps_avx(auVar189,auVar295);
  auVar96 = vmaxps_avx(auVar96,auVar189);
  local_228._0_4_ = auVar96._0_4_ * 0.99999964;
  local_228._4_4_ = auVar96._4_4_ * 0.99999964;
  local_228._8_4_ = auVar96._8_4_ * 0.99999964;
  local_228._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar254,auVar182);
  auVar189 = vpmaxsd_avx(auVar265,auVar156);
  auVar96 = vminps_avx(auVar96,auVar189);
  auVar189 = vpmaxsd_avx(auVar204,auVar78);
  fVar200 = ray->tfar;
  auVar183._4_4_ = fVar200;
  auVar183._0_4_ = fVar200;
  auVar183._8_4_ = fVar200;
  auVar183._12_4_ = fVar200;
  auVar189 = vminps_avx(auVar189,auVar183);
  auVar96 = vminps_avx(auVar96,auVar189);
  auVar79._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar189 = vpcmpgtd_avx(auVar96,_DAT_01f4ad30);
  auVar96 = vcmpps_avx(local_228,auVar79,2);
  auVar96 = vandps_avx(auVar96,auVar189);
  auVar144._16_16_ = mm_lookupmask_ps._240_16_;
  auVar144._0_16_ = mm_lookupmask_ps._240_16_;
  uVar73 = vmovmskps_avx(auVar96);
  local_198 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
  auVar59 = ZEXT412(0);
  local_2e0 = prim;
LAB_008b5572:
  auVar61._12_4_ = 0;
  auVar61._0_12_ = auVar59;
  if (uVar73 == 0) {
LAB_008b76a0:
    return uVar73 != 0;
  }
  lVar74 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
    }
  }
  local_410 = (ulong)*(uint *)(local_2e0 + 2);
  local_2e8 = (ulong)*(uint *)(local_2e0 + lVar74 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[local_410].ptr;
  fVar200 = (pGVar13->time_range).lower;
  fVar200 = pGVar13->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar200) / ((pGVar13->time_range).upper - fVar200));
  auVar96 = vroundss_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),9);
  auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar96 = vmaxss_avx(auVar61 << 0x20,auVar96);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           local_2e8 *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)auVar96._0_4_ * 0x38;
  lVar15 = *(long *)(_Var14 + lVar72);
  lVar16 = *(long *)(_Var14 + 0x10 + lVar72);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar68);
  fVar231 = *pfVar3;
  fVar225 = pfVar3[1];
  fVar249 = pfVar3[2];
  fVar227 = pfVar3[3];
  lVar74 = uVar68 + 1;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar74);
  lVar1 = uVar68 + 2;
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  lVar2 = uVar68 + 3;
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  fVar250 = *pfVar5;
  fVar229 = pfVar5[1];
  fVar251 = pfVar5[2];
  fVar180 = pfVar5[3];
  lVar15 = *(long *)&pGVar13[4].fnumTimeSegments;
  lVar16 = *(long *)(lVar15 + lVar72);
  lVar17 = *(long *)(lVar15 + 0x10 + lVar72);
  pfVar5 = (float *)(lVar16 + lVar17 * uVar68);
  fVar196 = *pfVar5;
  fVar197 = pfVar5[1];
  fVar198 = pfVar5[2];
  fVar199 = pfVar5[3];
  pfVar5 = (float *)(lVar16 + lVar17 * lVar74);
  pfVar6 = (float *)(lVar16 + lVar17 * lVar1);
  fVar200 = fVar200 - auVar96._0_4_;
  pfVar7 = (float *)(lVar16 + lVar17 * lVar2);
  fVar201 = *pfVar7;
  fVar226 = pfVar7[1];
  fVar228 = pfVar7[2];
  fVar230 = pfVar7[3];
  fVar293 = *pfVar4 * 0.0;
  fVar302 = pfVar4[1] * 0.0;
  fVar303 = pfVar4[2] * 0.0;
  fVar304 = pfVar4[3] * 0.0;
  fVar76 = fVar293 + fVar250 * 0.0;
  fVar113 = fVar302 + fVar229 * 0.0;
  fVar114 = fVar303 + fVar251 * 0.0;
  fVar115 = fVar304 + fVar180 * 0.0;
  fVar314 = *pfVar3 * 0.0;
  fVar322 = pfVar3[1] * 0.0;
  fVar324 = pfVar3[2] * 0.0;
  fVar326 = pfVar3[3] * 0.0;
  local_4c8._0_4_ = fVar231 + fVar314 + fVar76;
  local_4c8._4_4_ = fVar225 + fVar322 + fVar113;
  fStack_4c0 = fVar249 + fVar324 + fVar114;
  fStack_4bc = fVar227 + fVar326 + fVar115;
  auVar80._0_4_ = *pfVar3 * 3.0 + fVar76;
  auVar80._4_4_ = pfVar3[1] * 3.0 + fVar113;
  auVar80._8_4_ = pfVar3[2] * 3.0 + fVar114;
  auVar80._12_4_ = pfVar3[3] * 3.0 + fVar115;
  auVar150._0_4_ = fVar231 * 3.0;
  auVar150._4_4_ = fVar225 * 3.0;
  auVar150._8_4_ = fVar249 * 3.0;
  auVar150._12_4_ = fVar227 * 3.0;
  auVar263 = vsubps_avx(auVar80,auVar150);
  fVar328 = *pfVar6 * 0.0;
  fVar335 = pfVar6[1] * 0.0;
  fVar336 = pfVar6[2] * 0.0;
  fVar337 = pfVar6[3] * 0.0;
  fVar76 = fVar328 + fVar201 * 0.0;
  fVar113 = fVar335 + fVar226 * 0.0;
  fVar114 = fVar336 + fVar228 * 0.0;
  fVar115 = fVar337 + fVar230 * 0.0;
  fVar338 = *pfVar5 * 0.0;
  fVar344 = pfVar5[1] * 0.0;
  fVar345 = pfVar5[2] * 0.0;
  fVar346 = pfVar5[3] * 0.0;
  auVar348._0_4_ = fVar338 + fVar76 + fVar196;
  auVar348._4_4_ = fVar344 + fVar113 + fVar197;
  auVar348._8_4_ = fVar345 + fVar114 + fVar198;
  auVar348._12_4_ = fVar346 + fVar115 + fVar199;
  auVar81._0_4_ = *pfVar5 * 3.0 + fVar76;
  auVar81._4_4_ = pfVar5[1] * 3.0 + fVar113;
  auVar81._8_4_ = pfVar5[2] * 3.0 + fVar114;
  auVar81._12_4_ = pfVar5[3] * 3.0 + fVar115;
  auVar255._0_4_ = fVar196 * 3.0;
  auVar255._4_4_ = fVar197 * 3.0;
  auVar255._8_4_ = fVar198 * 3.0;
  auVar255._12_4_ = fVar199 * 3.0;
  auVar139 = vsubps_avx(auVar81,auVar255);
  auVar184._0_4_ = fVar231 * 0.0;
  auVar184._4_4_ = fVar225 * 0.0;
  auVar184._8_4_ = fVar249 * 0.0;
  auVar184._12_4_ = fVar227 * 0.0;
  auVar256._0_4_ = auVar184._0_4_ + fVar314 + fVar293 + fVar250;
  auVar256._4_4_ = auVar184._4_4_ + fVar322 + fVar302 + fVar229;
  auVar256._8_4_ = auVar184._8_4_ + fVar324 + fVar303 + fVar251;
  auVar256._12_4_ = auVar184._12_4_ + fVar326 + fVar304 + fVar180;
  auVar266._0_4_ = fVar250 * 3.0;
  auVar266._4_4_ = fVar229 * 3.0;
  auVar266._8_4_ = fVar251 * 3.0;
  auVar266._12_4_ = fVar180 * 3.0;
  auVar205._0_4_ = *pfVar4 * 3.0;
  auVar205._4_4_ = pfVar4[1] * 3.0;
  auVar205._8_4_ = pfVar4[2] * 3.0;
  auVar205._12_4_ = pfVar4[3] * 3.0;
  auVar96 = vsubps_avx(auVar266,auVar205);
  auVar206._0_4_ = fVar314 + auVar96._0_4_;
  auVar206._4_4_ = fVar322 + auVar96._4_4_;
  auVar206._8_4_ = fVar324 + auVar96._8_4_;
  auVar206._12_4_ = fVar326 + auVar96._12_4_;
  auVar20 = vsubps_avx(auVar206,auVar184);
  auVar207._0_4_ = fVar196 * 0.0;
  auVar207._4_4_ = fVar197 * 0.0;
  auVar207._8_4_ = fVar198 * 0.0;
  auVar207._12_4_ = fVar199 * 0.0;
  auVar185._0_4_ = auVar207._0_4_ + fVar338 + fVar328 + fVar201;
  auVar185._4_4_ = auVar207._4_4_ + fVar344 + fVar335 + fVar226;
  auVar185._8_4_ = auVar207._8_4_ + fVar345 + fVar336 + fVar228;
  auVar185._12_4_ = auVar207._12_4_ + fVar346 + fVar337 + fVar230;
  auVar234._0_4_ = fVar201 * 3.0;
  auVar234._4_4_ = fVar226 * 3.0;
  auVar234._8_4_ = fVar228 * 3.0;
  auVar234._12_4_ = fVar230 * 3.0;
  auVar267._0_4_ = *pfVar6 * 3.0;
  auVar267._4_4_ = pfVar6[1] * 3.0;
  auVar267._8_4_ = pfVar6[2] * 3.0;
  auVar267._12_4_ = pfVar6[3] * 3.0;
  auVar96 = vsubps_avx(auVar234,auVar267);
  auVar235._0_4_ = fVar338 + auVar96._0_4_;
  auVar235._4_4_ = fVar344 + auVar96._4_4_;
  auVar235._8_4_ = fVar345 + auVar96._8_4_;
  auVar235._12_4_ = fVar346 + auVar96._12_4_;
  auVar162 = vsubps_avx(auVar235,auVar207);
  auVar96 = vshufps_avx(auVar263,auVar263,0xc9);
  auVar189 = vshufps_avx(auVar348,auVar348,0xc9);
  fVar76 = auVar263._0_4_;
  auVar236._0_4_ = fVar76 * auVar189._0_4_;
  fVar113 = auVar263._4_4_;
  auVar236._4_4_ = fVar113 * auVar189._4_4_;
  fVar114 = auVar263._8_4_;
  auVar236._8_4_ = fVar114 * auVar189._8_4_;
  fVar115 = auVar263._12_4_;
  auVar236._12_4_ = fVar115 * auVar189._12_4_;
  auVar277._0_4_ = auVar348._0_4_ * auVar96._0_4_;
  auVar277._4_4_ = auVar348._4_4_ * auVar96._4_4_;
  auVar277._8_4_ = auVar348._8_4_ * auVar96._8_4_;
  auVar277._12_4_ = auVar348._12_4_ * auVar96._12_4_;
  auVar189 = vsubps_avx(auVar277,auVar236);
  auVar176 = vshufps_avx(auVar189,auVar189,0xc9);
  auVar189 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar278._0_4_ = auVar189._0_4_ * fVar76;
  auVar278._4_4_ = auVar189._4_4_ * fVar113;
  auVar278._8_4_ = auVar189._8_4_ * fVar114;
  auVar278._12_4_ = auVar189._12_4_ * fVar115;
  auVar82._0_4_ = auVar96._0_4_ * auVar139._0_4_;
  auVar82._4_4_ = auVar96._4_4_ * auVar139._4_4_;
  auVar82._8_4_ = auVar96._8_4_ * auVar139._8_4_;
  auVar82._12_4_ = auVar96._12_4_ * auVar139._12_4_;
  auVar96 = vsubps_avx(auVar82,auVar278);
  auVar139 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar96 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar189 = vshufps_avx(auVar185,auVar185,0xc9);
  fVar338 = auVar20._0_4_;
  auVar279._0_4_ = fVar338 * auVar189._0_4_;
  fVar344 = auVar20._4_4_;
  auVar279._4_4_ = fVar344 * auVar189._4_4_;
  fVar345 = auVar20._8_4_;
  auVar279._8_4_ = fVar345 * auVar189._8_4_;
  fVar346 = auVar20._12_4_;
  auVar279._12_4_ = fVar346 * auVar189._12_4_;
  auVar186._0_4_ = auVar96._0_4_ * auVar185._0_4_;
  auVar186._4_4_ = auVar96._4_4_ * auVar185._4_4_;
  auVar186._8_4_ = auVar96._8_4_ * auVar185._8_4_;
  auVar186._12_4_ = auVar96._12_4_ * auVar185._12_4_;
  auVar189 = vsubps_avx(auVar186,auVar279);
  auVar127 = vshufps_avx(auVar189,auVar189,0xc9);
  auVar189 = vshufps_avx(auVar162,auVar162,0xc9);
  auVar280._0_4_ = fVar338 * auVar189._0_4_;
  auVar280._4_4_ = fVar344 * auVar189._4_4_;
  auVar280._8_4_ = fVar345 * auVar189._8_4_;
  auVar280._12_4_ = fVar346 * auVar189._12_4_;
  auVar208._0_4_ = auVar96._0_4_ * auVar162._0_4_;
  auVar208._4_4_ = auVar96._4_4_ * auVar162._4_4_;
  auVar208._8_4_ = auVar96._8_4_ * auVar162._8_4_;
  auVar208._12_4_ = auVar96._12_4_ * auVar162._12_4_;
  auVar96 = vdpps_avx(auVar176,auVar176,0x7f);
  auVar189 = vsubps_avx(auVar208,auVar280);
  auVar162 = vshufps_avx(auVar189,auVar189,0xc9);
  fVar225 = auVar96._0_4_;
  auVar281._4_12_ = ZEXT812(0) << 0x20;
  auVar281._0_4_ = fVar225;
  auVar189 = vrsqrtss_avx(auVar281,auVar281);
  fVar231 = auVar189._0_4_;
  auVar189 = ZEXT416((uint)(fVar231 * 1.5 - fVar225 * 0.5 * fVar231 * fVar231 * fVar231));
  auVar128 = vshufps_avx(auVar189,auVar189,0);
  fVar201 = auVar128._0_4_ * auVar176._0_4_;
  fVar226 = auVar128._4_4_ * auVar176._4_4_;
  fVar228 = auVar128._8_4_ * auVar176._8_4_;
  fVar230 = auVar128._12_4_ * auVar176._12_4_;
  auVar189 = vdpps_avx(auVar176,auVar139,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar83._0_4_ = auVar96._0_4_ * auVar139._0_4_;
  auVar83._4_4_ = auVar96._4_4_ * auVar139._4_4_;
  auVar83._8_4_ = auVar96._8_4_ * auVar139._8_4_;
  auVar83._12_4_ = auVar96._12_4_ * auVar139._12_4_;
  auVar96 = vshufps_avx(auVar189,auVar189,0);
  auVar237._0_4_ = auVar96._0_4_ * auVar176._0_4_;
  auVar237._4_4_ = auVar96._4_4_ * auVar176._4_4_;
  auVar237._8_4_ = auVar96._8_4_ * auVar176._8_4_;
  auVar237._12_4_ = auVar96._12_4_ * auVar176._12_4_;
  auVar19 = vsubps_avx(auVar83,auVar237);
  auVar96 = vrcpss_avx(auVar281,auVar281);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar225 * auVar96._0_4_)));
  auVar176 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar127,auVar127,0x7f);
  fVar293 = auVar96._0_4_;
  auVar282._4_12_ = ZEXT812(0) << 0x20;
  auVar282._0_4_ = fVar293;
  auVar189 = vrsqrtss_avx(auVar282,auVar282);
  fVar196 = auVar189._0_4_;
  auVar189 = vdpps_avx(auVar127,auVar162,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar357._0_4_ = auVar162._0_4_ * auVar96._0_4_;
  auVar357._4_4_ = auVar162._4_4_ * auVar96._4_4_;
  auVar357._8_4_ = auVar162._8_4_ * auVar96._8_4_;
  auVar357._12_4_ = auVar162._12_4_ * auVar96._12_4_;
  lVar16 = *(long *)(_Var14 + 0x38 + lVar72);
  lVar17 = *(long *)(_Var14 + 0x48 + lVar72);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar68);
  fVar231 = *pfVar3;
  fVar225 = pfVar3[1];
  fVar249 = pfVar3[2];
  fVar227 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + lVar17 * lVar74);
  pfVar4 = (float *)(lVar16 + lVar17 * lVar1);
  auVar96 = vshufps_avx(auVar189,auVar189,0);
  auVar84._0_4_ = auVar127._0_4_ * auVar96._0_4_;
  auVar84._4_4_ = auVar127._4_4_ * auVar96._4_4_;
  auVar84._8_4_ = auVar127._8_4_ * auVar96._8_4_;
  auVar84._12_4_ = auVar127._12_4_ * auVar96._12_4_;
  auVar162 = vsubps_avx(auVar357,auVar84);
  pfVar5 = (float *)(lVar16 + lVar17 * lVar2);
  fVar250 = *pfVar5;
  fVar229 = pfVar5[1];
  fVar251 = pfVar5[2];
  fVar180 = pfVar5[3];
  auVar96 = ZEXT416((uint)(fVar196 * 1.5 - fVar293 * 0.5 * fVar196 * fVar196 * fVar196));
  auVar189 = vshufps_avx(auVar96,auVar96,0);
  fVar196 = auVar189._0_4_ * auVar127._0_4_;
  fVar197 = auVar189._4_4_ * auVar127._4_4_;
  fVar198 = auVar189._8_4_ * auVar127._8_4_;
  fVar199 = auVar189._12_4_ * auVar127._12_4_;
  auVar96 = vrcpss_avx(auVar282,auVar282);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - auVar96._0_4_ * fVar293)));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar139 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar349._0_4_ = auVar139._0_4_ * fVar201;
  auVar349._4_4_ = auVar139._4_4_ * fVar226;
  auVar349._8_4_ = auVar139._8_4_ * fVar228;
  auVar349._12_4_ = auVar139._12_4_ * fVar230;
  auVar127 = vshufps_avx(auVar263,auVar263,0xff);
  auVar331 = vsubps_avx(_local_4c8,auVar349);
  auVar268._0_4_ =
       auVar127._0_4_ * fVar201 + auVar139._0_4_ * auVar128._0_4_ * auVar19._0_4_ * auVar176._0_4_;
  auVar268._4_4_ =
       auVar127._4_4_ * fVar226 + auVar139._4_4_ * auVar128._4_4_ * auVar19._4_4_ * auVar176._4_4_;
  auVar268._8_4_ =
       auVar127._8_4_ * fVar228 + auVar139._8_4_ * auVar128._8_4_ * auVar19._8_4_ * auVar176._8_4_;
  auVar268._12_4_ =
       auVar127._12_4_ * fVar230 +
       auVar139._12_4_ * auVar128._12_4_ * auVar19._12_4_ * auVar176._12_4_;
  auVar128 = vsubps_avx(auVar263,auVar268);
  local_4c8._0_4_ = (float)local_4c8._0_4_ + auVar349._0_4_;
  local_4c8._4_4_ = (float)local_4c8._4_4_ + auVar349._4_4_;
  fStack_4c0 = fStack_4c0 + auVar349._8_4_;
  fStack_4bc = fStack_4bc + auVar349._12_4_;
  auVar176 = vshufps_avx(auVar256,auVar256,0xff);
  auVar151._0_4_ = auVar176._0_4_ * fVar196;
  auVar151._4_4_ = auVar176._4_4_ * fVar197;
  auVar151._8_4_ = auVar176._8_4_ * fVar198;
  auVar151._12_4_ = auVar176._12_4_ * fVar199;
  auVar139 = vshufps_avx(auVar20,auVar20,0xff);
  auVar263 = vsubps_avx(auVar256,auVar151);
  auVar85._0_4_ =
       auVar139._0_4_ * fVar196 + auVar176._0_4_ * auVar189._0_4_ * auVar162._0_4_ * auVar96._0_4_;
  auVar85._4_4_ =
       auVar139._4_4_ * fVar197 + auVar176._4_4_ * auVar189._4_4_ * auVar162._4_4_ * auVar96._4_4_;
  auVar85._8_4_ =
       auVar139._8_4_ * fVar198 + auVar176._8_4_ * auVar189._8_4_ * auVar162._8_4_ * auVar96._8_4_;
  auVar85._12_4_ =
       auVar139._12_4_ * fVar199 +
       auVar176._12_4_ * auVar189._12_4_ * auVar162._12_4_ * auVar96._12_4_;
  auVar20 = vsubps_avx(auVar20,auVar85);
  local_448._4_4_ = auVar256._4_4_ + auVar151._4_4_;
  local_448._0_4_ = auVar256._0_4_ + auVar151._0_4_;
  fStack_440 = auVar256._8_4_ + auVar151._8_4_;
  fStack_43c = auVar256._12_4_ + auVar151._12_4_;
  fVar314 = *pfVar4 * 0.0;
  fVar322 = pfVar4[1] * 0.0;
  fVar324 = pfVar4[2] * 0.0;
  fVar326 = pfVar4[3] * 0.0;
  fVar355 = fVar314 + fVar250 * 0.0;
  fVar360 = fVar322 + fVar229 * 0.0;
  fVar361 = fVar324 + fVar251 * 0.0;
  fVar362 = fVar326 + fVar180 * 0.0;
  auVar86._0_4_ = fVar355 + *pfVar3 * 3.0;
  auVar86._4_4_ = fVar360 + pfVar3[1] * 3.0;
  auVar86._8_4_ = fVar361 + pfVar3[2] * 3.0;
  auVar86._12_4_ = fVar362 + pfVar3[3] * 3.0;
  auVar152._0_4_ = fVar231 * 3.0;
  auVar152._4_4_ = fVar225 * 3.0;
  auVar152._8_4_ = fVar249 * 3.0;
  auVar152._12_4_ = fVar227 * 3.0;
  auVar19 = vsubps_avx(auVar86,auVar152);
  lVar16 = *(long *)(lVar15 + 0x38 + lVar72);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar72);
  auVar96 = *(undefined1 (*) [16])(lVar16 + lVar1 * lVar15);
  pfVar5 = (float *)(lVar16 + lVar15 * lVar2);
  fVar196 = *pfVar5;
  fVar197 = pfVar5[1];
  fVar198 = pfVar5[2];
  fVar199 = pfVar5[3];
  fVar293 = auVar96._0_4_ * 0.0;
  fVar302 = auVar96._4_4_ * 0.0;
  fVar303 = auVar96._8_4_ * 0.0;
  fVar304 = auVar96._12_4_ * 0.0;
  fVar328 = fVar293 + fVar196 * 0.0;
  fVar335 = fVar302 + fVar197 * 0.0;
  fVar336 = fVar303 + fVar198 * 0.0;
  fVar337 = fVar304 + fVar199 * 0.0;
  pfVar5 = (float *)(lVar16 + lVar74 * lVar15);
  auVar350._0_4_ = *pfVar5 * 3.0 + fVar328;
  auVar350._4_4_ = pfVar5[1] * 3.0 + fVar335;
  auVar350._8_4_ = pfVar5[2] * 3.0 + fVar336;
  auVar350._12_4_ = pfVar5[3] * 3.0 + fVar337;
  pfVar6 = (float *)(lVar16 + uVar68 * lVar15);
  fVar201 = *pfVar6;
  fVar226 = pfVar6[1];
  fVar228 = pfVar6[2];
  fVar230 = pfVar6[3];
  auVar283._0_4_ = fVar201 * 3.0;
  auVar283._4_4_ = fVar226 * 3.0;
  auVar283._8_4_ = fVar228 * 3.0;
  auVar283._12_4_ = fVar230 * 3.0;
  auVar189 = vsubps_avx(auVar350,auVar283);
  auVar284._0_4_ = fVar250 * 3.0;
  auVar284._4_4_ = fVar229 * 3.0;
  auVar284._8_4_ = fVar251 * 3.0;
  auVar284._12_4_ = fVar180 * 3.0;
  auVar329._0_4_ = *pfVar4 * 3.0;
  auVar329._4_4_ = pfVar4[1] * 3.0;
  auVar329._8_4_ = pfVar4[2] * 3.0;
  auVar329._12_4_ = pfVar4[3] * 3.0;
  auVar176 = vsubps_avx(auVar284,auVar329);
  fVar315 = *pfVar3 * 0.0;
  fVar323 = pfVar3[1] * 0.0;
  fVar325 = pfVar3[2] * 0.0;
  fVar327 = pfVar3[3] * 0.0;
  auVar285._0_4_ = fVar315 + auVar176._0_4_;
  auVar285._4_4_ = fVar323 + auVar176._4_4_;
  auVar285._8_4_ = fVar325 + auVar176._8_4_;
  auVar285._12_4_ = fVar327 + auVar176._12_4_;
  auVar330._0_4_ = fVar231 + fVar315 + fVar355;
  auVar330._4_4_ = fVar225 + fVar323 + fVar360;
  auVar330._8_4_ = fVar249 + fVar325 + fVar361;
  auVar330._12_4_ = fVar227 + fVar327 + fVar362;
  auVar306._0_4_ = fVar231 * 0.0;
  auVar306._4_4_ = fVar225 * 0.0;
  auVar306._8_4_ = fVar249 * 0.0;
  auVar306._12_4_ = fVar227 * 0.0;
  local_4d8._0_4_ = auVar306._0_4_ + fVar315 + fVar250 + fVar314;
  local_4d8._4_4_ = auVar306._4_4_ + fVar323 + fVar229 + fVar322;
  fStack_4d0 = auVar306._8_4_ + fVar325 + fVar251 + fVar324;
  fStack_4cc = auVar306._12_4_ + fVar327 + fVar180 + fVar326;
  auVar21 = vsubps_avx(auVar285,auVar306);
  auVar117._0_4_ = fVar196 * 3.0;
  auVar117._4_4_ = fVar197 * 3.0;
  auVar117._8_4_ = fVar198 * 3.0;
  auVar117._12_4_ = fVar199 * 3.0;
  auVar209._0_4_ = auVar96._0_4_ * 3.0;
  auVar209._4_4_ = auVar96._4_4_ * 3.0;
  auVar209._8_4_ = auVar96._8_4_ * 3.0;
  auVar209._12_4_ = auVar96._12_4_ * 3.0;
  auVar96 = vsubps_avx(auVar117,auVar209);
  fVar231 = *pfVar5 * 0.0;
  fVar225 = pfVar5[1] * 0.0;
  fVar249 = pfVar5[2] * 0.0;
  fVar227 = pfVar5[3] * 0.0;
  auVar118._0_4_ = fVar231 + auVar96._0_4_;
  auVar118._4_4_ = fVar225 + auVar96._4_4_;
  auVar118._8_4_ = fVar249 + auVar96._8_4_;
  auVar118._12_4_ = fVar227 + auVar96._12_4_;
  auVar153._0_4_ = fVar201 + fVar231 + fVar328;
  auVar153._4_4_ = fVar226 + fVar225 + fVar335;
  auVar153._8_4_ = fVar228 + fVar249 + fVar336;
  auVar153._12_4_ = fVar230 + fVar227 + fVar337;
  auVar87._0_4_ = fVar201 * 0.0;
  auVar87._4_4_ = fVar226 * 0.0;
  auVar87._8_4_ = fVar228 * 0.0;
  auVar87._12_4_ = fVar230 * 0.0;
  auVar187._0_4_ = auVar87._0_4_ + fVar231 + fVar293 + fVar196;
  auVar187._4_4_ = auVar87._4_4_ + fVar225 + fVar302 + fVar197;
  auVar187._8_4_ = auVar87._8_4_ + fVar249 + fVar303 + fVar198;
  auVar187._12_4_ = auVar87._12_4_ + fVar227 + fVar304 + fVar199;
  auVar139 = vsubps_avx(auVar118,auVar87);
  auVar96 = vshufps_avx(auVar153,auVar153,0xc9);
  fVar180 = auVar19._0_4_;
  auVar119._0_4_ = fVar180 * auVar96._0_4_;
  fVar196 = auVar19._4_4_;
  auVar119._4_4_ = fVar196 * auVar96._4_4_;
  fVar197 = auVar19._8_4_;
  auVar119._8_4_ = fVar197 * auVar96._8_4_;
  fVar198 = auVar19._12_4_;
  auVar119._12_4_ = fVar198 * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar154._0_4_ = auVar96._0_4_ * auVar153._0_4_;
  auVar154._4_4_ = auVar96._4_4_ * auVar153._4_4_;
  auVar154._8_4_ = auVar96._8_4_ * auVar153._8_4_;
  auVar154._12_4_ = auVar96._12_4_ * auVar153._12_4_;
  auVar176 = vsubps_avx(auVar154,auVar119);
  auVar155._0_4_ = auVar189._0_4_ * auVar96._0_4_;
  auVar155._4_4_ = auVar189._4_4_ * auVar96._4_4_;
  auVar155._8_4_ = auVar189._8_4_ * auVar96._8_4_;
  auVar155._12_4_ = auVar189._12_4_ * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar189,auVar189,0xc9);
  auVar210._0_4_ = fVar180 * auVar96._0_4_;
  auVar210._4_4_ = fVar196 * auVar96._4_4_;
  auVar210._8_4_ = fVar197 * auVar96._8_4_;
  auVar210._12_4_ = fVar198 * auVar96._12_4_;
  auVar127 = vsubps_avx(auVar155,auVar210);
  auVar96 = vshufps_avx(auVar187,auVar187,0xc9);
  fVar199 = auVar21._0_4_;
  auVar211._0_4_ = fVar199 * auVar96._0_4_;
  fVar201 = auVar21._4_4_;
  auVar211._4_4_ = fVar201 * auVar96._4_4_;
  fVar226 = auVar21._8_4_;
  auVar211._8_4_ = fVar226 * auVar96._8_4_;
  fVar228 = auVar21._12_4_;
  auVar211._12_4_ = fVar228 * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar188._0_4_ = auVar96._0_4_ * auVar187._0_4_;
  auVar188._4_4_ = auVar96._4_4_ * auVar187._4_4_;
  auVar188._8_4_ = auVar96._8_4_ * auVar187._8_4_;
  auVar188._12_4_ = auVar96._12_4_ * auVar187._12_4_;
  auVar162 = vsubps_avx(auVar188,auVar211);
  auVar176 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar120._0_4_ = auVar96._0_4_ * auVar139._0_4_;
  auVar120._4_4_ = auVar96._4_4_ * auVar139._4_4_;
  auVar120._8_4_ = auVar96._8_4_ * auVar139._8_4_;
  auVar120._12_4_ = auVar96._12_4_ * auVar139._12_4_;
  auVar189 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar96 = vdpps_avx(auVar176,auVar176,0x7f);
  auVar88._0_4_ = fVar199 * auVar189._0_4_;
  auVar88._4_4_ = fVar201 * auVar189._4_4_;
  auVar88._8_4_ = fVar226 * auVar189._8_4_;
  auVar88._12_4_ = fVar228 * auVar189._12_4_;
  auVar78 = vsubps_avx(auVar120,auVar88);
  auVar139 = vshufps_avx(auVar127,auVar127,0xc9);
  fVar231 = auVar96._0_4_;
  auVar127 = ZEXT416((uint)fVar231);
  auVar189 = vrsqrtss_avx(auVar127,auVar127);
  fVar225 = auVar189._0_4_;
  auVar189 = vdpps_avx(auVar176,auVar139,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar89._0_4_ = auVar96._0_4_ * auVar139._0_4_;
  auVar89._4_4_ = auVar96._4_4_ * auVar139._4_4_;
  auVar89._8_4_ = auVar96._8_4_ * auVar139._8_4_;
  auVar89._12_4_ = auVar96._12_4_ * auVar139._12_4_;
  auVar96 = vshufps_avx(auVar189,auVar189,0);
  auVar238._0_4_ = auVar176._0_4_ * auVar96._0_4_;
  auVar238._4_4_ = auVar176._4_4_ * auVar96._4_4_;
  auVar238._8_4_ = auVar176._8_4_ * auVar96._8_4_;
  auVar238._12_4_ = auVar176._12_4_ * auVar96._12_4_;
  auVar79 = vsubps_avx(auVar89,auVar238);
  auVar96 = vrcpss_avx(auVar127,auVar127);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar231 * auVar96._0_4_)));
  auVar139 = vshufps_avx(auVar96,auVar96,0);
  auVar127 = vshufps_avx(auVar162,auVar162,0xc9);
  auVar96 = ZEXT416((uint)(fVar225 * 1.5 - fVar231 * 0.5 * fVar225 * fVar225 * fVar225));
  auVar162 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar127,auVar127,0x7f);
  fVar250 = auVar176._0_4_ * auVar162._0_4_;
  fVar229 = auVar176._4_4_ * auVar162._4_4_;
  fVar251 = auVar176._8_4_ * auVar162._8_4_;
  fVar230 = auVar176._12_4_ * auVar162._12_4_;
  auVar176 = vshufps_avx(auVar78,auVar78,0xc9);
  fVar225 = auVar96._0_4_;
  auVar156 = ZEXT416((uint)fVar225);
  auVar189 = vrsqrtss_avx(auVar156,auVar156);
  fVar231 = auVar189._0_4_;
  auVar189 = vdpps_avx(auVar127,auVar176,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar121._0_4_ = auVar96._0_4_ * auVar176._0_4_;
  auVar121._4_4_ = auVar96._4_4_ * auVar176._4_4_;
  auVar121._8_4_ = auVar96._8_4_ * auVar176._8_4_;
  auVar121._12_4_ = auVar96._12_4_ * auVar176._12_4_;
  auVar96 = vshufps_avx(auVar189,auVar189,0);
  auVar239._0_4_ = auVar127._0_4_ * auVar96._0_4_;
  auVar239._4_4_ = auVar127._4_4_ * auVar96._4_4_;
  auVar239._8_4_ = auVar127._8_4_ * auVar96._8_4_;
  auVar239._12_4_ = auVar127._12_4_ * auVar96._12_4_;
  auVar78 = vsubps_avx(auVar121,auVar239);
  auVar96 = vrcpss_avx(auVar156,auVar156);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar225 * auVar96._0_4_)));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar189 = ZEXT416((uint)(fVar231 * 1.5 - fVar225 * 0.5 * fVar231 * fVar231 * fVar231));
  auVar189 = vshufps_avx(auVar189,auVar189,0);
  fVar231 = auVar127._0_4_ * auVar189._0_4_;
  fVar225 = auVar127._4_4_ * auVar189._4_4_;
  fVar249 = auVar127._8_4_ * auVar189._8_4_;
  fVar227 = auVar127._12_4_ * auVar189._12_4_;
  auVar176 = vshufps_avx(auVar19,auVar19,0xff);
  auVar127 = vshufps_avx(auVar330,auVar330,0xff);
  auVar212._0_4_ = fVar250 * auVar127._0_4_;
  auVar212._4_4_ = fVar229 * auVar127._4_4_;
  auVar212._8_4_ = fVar251 * auVar127._8_4_;
  auVar212._12_4_ = fVar230 * auVar127._12_4_;
  auVar157._0_4_ =
       fVar250 * auVar176._0_4_ + auVar162._0_4_ * auVar79._0_4_ * auVar139._0_4_ * auVar127._0_4_;
  auVar157._4_4_ =
       fVar229 * auVar176._4_4_ + auVar162._4_4_ * auVar79._4_4_ * auVar139._4_4_ * auVar127._4_4_;
  auVar157._8_4_ =
       fVar251 * auVar176._8_4_ + auVar162._8_4_ * auVar79._8_4_ * auVar139._8_4_ * auVar127._8_4_;
  auVar157._12_4_ =
       fVar230 * auVar176._12_4_ +
       auVar162._12_4_ * auVar79._12_4_ * auVar139._12_4_ * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar330,auVar212);
  auVar162 = vsubps_avx(auVar19,auVar157);
  auVar176 = vshufps_avx(auVar21,auVar21,0xff);
  auVar139 = vshufps_avx(_local_4d8,_local_4d8,0xff);
  auVar90._0_4_ = auVar139._0_4_ * fVar231;
  auVar90._4_4_ = auVar139._4_4_ * fVar225;
  auVar90._8_4_ = auVar139._8_4_ * fVar249;
  auVar90._12_4_ = auVar139._12_4_ * fVar227;
  auVar122._0_4_ =
       auVar176._0_4_ * fVar231 + auVar139._0_4_ * auVar189._0_4_ * auVar78._0_4_ * auVar96._0_4_;
  auVar122._4_4_ =
       auVar176._4_4_ * fVar225 + auVar139._4_4_ * auVar189._4_4_ * auVar78._4_4_ * auVar96._4_4_;
  auVar122._8_4_ =
       auVar176._8_4_ * fVar249 + auVar139._8_4_ * auVar189._8_4_ * auVar78._8_4_ * auVar96._8_4_;
  auVar122._12_4_ =
       auVar176._12_4_ * fVar227 +
       auVar139._12_4_ * auVar189._12_4_ * auVar78._12_4_ * auVar96._12_4_;
  auVar176 = vsubps_avx(_local_4d8,auVar90);
  local_4d8._0_4_ = (float)local_4d8._0_4_ + auVar90._0_4_;
  local_4d8._4_4_ = (float)local_4d8._4_4_ + auVar90._4_4_;
  fStack_4d0 = fStack_4d0 + auVar90._8_4_;
  fStack_4cc = fStack_4cc + auVar90._12_4_;
  auVar139 = vsubps_avx(auVar21,auVar122);
  local_3f8._0_4_ = auVar128._0_4_;
  local_3f8._4_4_ = auVar128._4_4_;
  fStack_3f0 = auVar128._8_4_;
  fStack_3ec = auVar128._12_4_;
  local_308._0_4_ = auVar331._0_4_;
  local_308._4_4_ = auVar331._4_4_;
  fStack_300 = auVar331._8_4_;
  fStack_2fc = auVar331._12_4_;
  auVar96 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
  auVar189 = vshufps_avx(ZEXT416((uint)(1.0 - fVar200)),ZEXT416((uint)(1.0 - fVar200)),0);
  fVar227 = auVar96._0_4_;
  fVar250 = auVar96._4_4_;
  fVar229 = auVar96._8_4_;
  fVar251 = auVar96._12_4_;
  fVar200 = auVar189._0_4_;
  fVar231 = auVar189._4_4_;
  fVar225 = auVar189._8_4_;
  fVar249 = auVar189._12_4_;
  local_378._0_4_ = fVar200 * (float)local_308._0_4_ + fVar227 * auVar127._0_4_;
  local_378._4_4_ = fVar231 * (float)local_308._4_4_ + fVar250 * auVar127._4_4_;
  fStack_370 = fVar225 * fStack_300 + fVar229 * auVar127._8_4_;
  fStack_36c = fVar249 * fStack_2fc + fVar251 * auVar127._12_4_;
  local_388._0_4_ =
       fVar200 * ((float)local_308._0_4_ + (float)local_3f8._0_4_ * 0.33333334) +
       fVar227 * (auVar127._0_4_ + auVar162._0_4_ * 0.33333334);
  local_388._4_4_ =
       fVar231 * ((float)local_308._4_4_ + (float)local_3f8._4_4_ * 0.33333334) +
       fVar250 * (auVar127._4_4_ + auVar162._4_4_ * 0.33333334);
  fStack_380 = fVar225 * (fStack_300 + fStack_3f0 * 0.33333334) +
               fVar229 * (auVar127._8_4_ + auVar162._8_4_ * 0.33333334);
  fStack_37c = fVar249 * (fStack_2fc + fStack_3ec * 0.33333334) +
               fVar251 * (auVar127._12_4_ + auVar162._12_4_ * 0.33333334);
  local_498._0_4_ = auVar20._0_4_;
  local_498._4_4_ = auVar20._4_4_;
  fStack_490 = auVar20._8_4_;
  fStack_48c = auVar20._12_4_;
  auVar190._0_4_ = (float)local_498._0_4_ * 0.33333334;
  auVar190._4_4_ = (float)local_498._4_4_ * 0.33333334;
  auVar190._8_4_ = fStack_490 * 0.33333334;
  auVar190._12_4_ = fStack_48c * 0.33333334;
  auVar96 = vsubps_avx(auVar263,auVar190);
  auVar240._0_4_ = (fVar338 + auVar85._0_4_) * 0.33333334;
  auVar240._4_4_ = (fVar344 + auVar85._4_4_) * 0.33333334;
  auVar240._8_4_ = (fVar345 + auVar85._8_4_) * 0.33333334;
  auVar240._12_4_ = (fVar346 + auVar85._12_4_) * 0.33333334;
  auVar189 = vsubps_avx(_local_448,auVar240);
  auVar158._0_4_ = auVar139._0_4_ * 0.33333334;
  auVar158._4_4_ = auVar139._4_4_ * 0.33333334;
  auVar158._8_4_ = auVar139._8_4_ * 0.33333334;
  auVar158._12_4_ = auVar139._12_4_ * 0.33333334;
  auVar139 = vsubps_avx(auVar176,auVar158);
  auVar123._0_4_ = (fVar199 + auVar122._0_4_) * 0.33333334;
  auVar123._4_4_ = (fVar201 + auVar122._4_4_) * 0.33333334;
  auVar123._8_4_ = (fVar226 + auVar122._8_4_) * 0.33333334;
  auVar123._12_4_ = (fVar228 + auVar122._12_4_) * 0.33333334;
  auVar127 = vsubps_avx(_local_4d8,auVar123);
  local_398._0_4_ = fVar200 * auVar96._0_4_ + fVar227 * auVar139._0_4_;
  local_398._4_4_ = fVar231 * auVar96._4_4_ + fVar250 * auVar139._4_4_;
  fStack_390 = fVar225 * auVar96._8_4_ + fVar229 * auVar139._8_4_;
  fStack_38c = fVar249 * auVar96._12_4_ + fVar251 * auVar139._12_4_;
  local_3a8._0_4_ = fVar227 * auVar176._0_4_ + auVar263._0_4_ * fVar200;
  local_3a8._4_4_ = fVar250 * auVar176._4_4_ + auVar263._4_4_ * fVar231;
  fStack_3a0 = fVar229 * auVar176._8_4_ + auVar263._8_4_ * fVar225;
  fStack_39c = fVar251 * auVar176._12_4_ + auVar263._12_4_ * fVar249;
  local_3b8._0_4_ = fVar200 * (float)local_4c8._0_4_ + fVar227 * (auVar330._0_4_ + auVar212._0_4_);
  local_3b8._4_4_ = fVar231 * (float)local_4c8._4_4_ + fVar250 * (auVar330._4_4_ + auVar212._4_4_);
  fStack_3b0 = fVar225 * fStack_4c0 + fVar229 * (auVar330._8_4_ + auVar212._8_4_);
  fStack_3ac = fVar249 * fStack_4bc + fVar251 * (auVar330._12_4_ + auVar212._12_4_);
  local_3c8._0_4_ =
       fVar200 * ((float)local_4c8._0_4_ + (fVar76 + auVar268._0_4_) * 0.33333334) +
       fVar227 * (auVar330._0_4_ + auVar212._0_4_ + (fVar180 + auVar157._0_4_) * 0.33333334);
  local_3c8._4_4_ =
       fVar231 * ((float)local_4c8._4_4_ + (fVar113 + auVar268._4_4_) * 0.33333334) +
       fVar250 * (auVar330._4_4_ + auVar212._4_4_ + (fVar196 + auVar157._4_4_) * 0.33333334);
  fStack_3c0 = fVar225 * (fStack_4c0 + (fVar114 + auVar268._8_4_) * 0.33333334) +
               fVar229 * (auVar330._8_4_ + auVar212._8_4_ + (fVar197 + auVar157._8_4_) * 0.33333334)
  ;
  fStack_3bc = fVar249 * (fStack_4bc + (fVar115 + auVar268._12_4_) * 0.33333334) +
               fVar251 * (auVar330._12_4_ + auVar212._12_4_ +
                         (fVar198 + auVar157._12_4_) * 0.33333334);
  local_3d8 = fVar200 * auVar189._0_4_ + fVar227 * auVar127._0_4_;
  fStack_3d4 = fVar231 * auVar189._4_4_ + fVar250 * auVar127._4_4_;
  fStack_3d0 = fVar225 * auVar189._8_4_ + fVar229 * auVar127._8_4_;
  fStack_3cc = fVar249 * auVar189._12_4_ + fVar251 * auVar127._12_4_;
  local_408 = (auVar256._0_4_ + auVar151._0_4_) * fVar200 + fVar227 * (float)local_4d8._0_4_;
  fStack_404 = (auVar256._4_4_ + auVar151._4_4_) * fVar231 + fVar250 * (float)local_4d8._4_4_;
  fStack_400 = (auVar256._8_4_ + auVar151._8_4_) * fVar225 + fVar229 * fStack_4d0;
  fStack_3fc = (auVar256._12_4_ + auVar151._12_4_) * fVar249 + fVar251 * fStack_4cc;
  aVar11 = (ray->org).field_0;
  auVar176 = vsubps_avx(_local_378,(undefined1  [16])aVar11);
  auVar189 = vmovsldup_avx(auVar176);
  auVar96 = vmovshdup_avx(auVar176);
  auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar200 = (pre->ray_space).vx.field_0.m128[0];
  fVar231 = (pre->ray_space).vx.field_0.m128[1];
  fVar225 = (pre->ray_space).vx.field_0.m128[2];
  fVar249 = (pre->ray_space).vx.field_0.m128[3];
  fVar227 = (pre->ray_space).vy.field_0.m128[0];
  fVar250 = (pre->ray_space).vy.field_0.m128[1];
  fVar229 = (pre->ray_space).vy.field_0.m128[2];
  fVar251 = (pre->ray_space).vy.field_0.m128[3];
  fVar180 = (pre->ray_space).vz.field_0.m128[0];
  fVar196 = (pre->ray_space).vz.field_0.m128[1];
  fVar197 = (pre->ray_space).vz.field_0.m128[2];
  fVar198 = (pre->ray_space).vz.field_0.m128[3];
  local_4e8._4_4_ = fVar231 * auVar189._4_4_ + fVar250 * auVar96._4_4_ + fVar196 * auVar176._4_4_;
  local_4e8._0_4_ = fVar200 * auVar189._0_4_ + fVar227 * auVar96._0_4_ + fVar180 * auVar176._0_4_;
  fStack_4e0 = fVar225 * auVar189._8_4_ + fVar229 * auVar96._8_4_ + fVar197 * auVar176._8_4_;
  fStack_4dc = fVar249 * auVar189._12_4_ + fVar251 * auVar96._12_4_ + fVar198 * auVar176._12_4_;
  auVar176 = vsubps_avx(_local_388,(undefined1  [16])aVar11);
  auVar189 = vmovsldup_avx(auVar176);
  auVar96 = vmovshdup_avx(auVar176);
  auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
  auVar341._0_8_ =
       CONCAT44(fVar231 * auVar189._4_4_ + fVar250 * auVar96._4_4_ + fVar196 * auVar176._4_4_,
                fVar200 * auVar189._0_4_ + fVar227 * auVar96._0_4_ + fVar180 * auVar176._0_4_);
  auVar341._8_4_ = fVar225 * auVar189._8_4_ + fVar229 * auVar96._8_4_ + fVar197 * auVar176._8_4_;
  auVar341._12_4_ = fVar249 * auVar189._12_4_ + fVar251 * auVar96._12_4_ + fVar198 * auVar176._12_4_
  ;
  auVar189 = vsubps_avx(_local_398,(undefined1  [16])aVar11);
  auVar176 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar96 = vmovshdup_avx(auVar189);
  auVar189 = vmovsldup_avx(auVar189);
  auVar124._0_8_ =
       CONCAT44(fVar231 * auVar189._4_4_ + auVar96._4_4_ * fVar250 + fVar196 * auVar176._4_4_,
                fVar200 * auVar189._0_4_ + auVar96._0_4_ * fVar227 + fVar180 * auVar176._0_4_);
  auVar124._8_4_ = fVar225 * auVar189._8_4_ + auVar96._8_4_ * fVar229 + fVar197 * auVar176._8_4_;
  auVar124._12_4_ = fVar249 * auVar189._12_4_ + auVar96._12_4_ * fVar251 + fVar198 * auVar176._12_4_
  ;
  auVar189 = vsubps_avx(_local_3a8,(undefined1  [16])aVar11);
  auVar176 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar96 = vmovshdup_avx(auVar189);
  auVar189 = vmovsldup_avx(auVar189);
  auVar269._0_8_ =
       CONCAT44(auVar96._4_4_ * fVar250 + auVar176._4_4_ * fVar196 + fVar231 * auVar189._4_4_,
                auVar96._0_4_ * fVar227 + auVar176._0_4_ * fVar180 + fVar200 * auVar189._0_4_);
  auVar269._8_4_ = auVar96._8_4_ * fVar229 + auVar176._8_4_ * fVar197 + fVar225 * auVar189._8_4_;
  auVar269._12_4_ = auVar96._12_4_ * fVar251 + auVar176._12_4_ * fVar198 + fVar249 * auVar189._12_4_
  ;
  auVar189 = vsubps_avx(_local_3b8,(undefined1  [16])aVar11);
  auVar176 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar96 = vmovshdup_avx(auVar189);
  auVar189 = vmovsldup_avx(auVar189);
  auVar286._0_8_ =
       CONCAT44(auVar189._4_4_ * fVar231 + auVar96._4_4_ * fVar250 + auVar176._4_4_ * fVar196,
                auVar189._0_4_ * fVar200 + auVar96._0_4_ * fVar227 + auVar176._0_4_ * fVar180);
  auVar286._8_4_ = auVar189._8_4_ * fVar225 + auVar96._8_4_ * fVar229 + auVar176._8_4_ * fVar197;
  auVar286._12_4_ = auVar189._12_4_ * fVar249 + auVar96._12_4_ * fVar251 + auVar176._12_4_ * fVar198
  ;
  auVar189 = vsubps_avx(_local_3c8,(undefined1  [16])aVar11);
  auVar176 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar96 = vmovshdup_avx(auVar189);
  auVar189 = vmovsldup_avx(auVar189);
  auVar296._0_4_ = auVar189._0_4_ * fVar200 + auVar96._0_4_ * fVar227 + auVar176._0_4_ * fVar180;
  auVar296._4_4_ = auVar189._4_4_ * fVar231 + auVar96._4_4_ * fVar250 + auVar176._4_4_ * fVar196;
  auVar296._8_4_ = auVar189._8_4_ * fVar225 + auVar96._8_4_ * fVar229 + auVar176._8_4_ * fVar197;
  auVar296._12_4_ = auVar189._12_4_ * fVar249 + auVar96._12_4_ * fVar251 + auVar176._12_4_ * fVar198
  ;
  auVar65._4_4_ = fStack_3d4;
  auVar65._0_4_ = local_3d8;
  auVar65._8_4_ = fStack_3d0;
  auVar65._12_4_ = fStack_3cc;
  auVar189 = vsubps_avx(auVar65,(undefined1  [16])aVar11);
  auVar176 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar96 = vmovshdup_avx(auVar189);
  auVar189 = vmovsldup_avx(auVar189);
  auVar307._0_8_ =
       CONCAT44(auVar189._4_4_ * fVar231 + auVar96._4_4_ * fVar250 + auVar176._4_4_ * fVar196,
                auVar189._0_4_ * fVar200 + auVar96._0_4_ * fVar227 + auVar176._0_4_ * fVar180);
  auVar307._8_4_ = auVar189._8_4_ * fVar225 + auVar96._8_4_ * fVar229 + auVar176._8_4_ * fVar197;
  auVar307._12_4_ = auVar189._12_4_ * fVar249 + auVar96._12_4_ * fVar251 + auVar176._12_4_ * fVar198
  ;
  auVar62._4_4_ = fStack_404;
  auVar62._0_4_ = local_408;
  auVar62._8_4_ = fStack_400;
  auVar62._12_4_ = fStack_3fc;
  auVar189 = vsubps_avx(auVar62,(undefined1  [16])aVar11);
  auVar176 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar96 = vmovshdup_avx(auVar189);
  auVar189 = vmovsldup_avx(auVar189);
  auVar91._0_8_ =
       CONCAT44(fVar231 * auVar189._4_4_ + auVar96._4_4_ * fVar250 + auVar176._4_4_ * fVar196,
                fVar200 * auVar189._0_4_ + auVar96._0_4_ * fVar227 + auVar176._0_4_ * fVar180);
  auVar91._8_4_ = fVar225 * auVar189._8_4_ + auVar96._8_4_ * fVar229 + auVar176._8_4_ * fVar197;
  auVar91._12_4_ = fVar249 * auVar189._12_4_ + auVar96._12_4_ * fVar251 + auVar176._12_4_ * fVar198;
  _local_448 = vmovlhps_avx(_local_4e8,auVar286);
  _local_458 = vmovlhps_avx(auVar341,auVar296);
  _local_468 = vmovlhps_avx(auVar124,auVar307);
  _local_1f8 = vmovlhps_avx(auVar269,auVar91);
  auVar96 = vminps_avx(_local_448,_local_458);
  auVar189 = vminps_avx(_local_468,_local_1f8);
  auVar176 = vminps_avx(auVar96,auVar189);
  auVar96 = vmaxps_avx(_local_448,_local_458);
  auVar189 = vmaxps_avx(_local_468,_local_1f8);
  auVar96 = vmaxps_avx(auVar96,auVar189);
  auVar189 = vshufpd_avx(auVar176,auVar176,3);
  auVar176 = vminps_avx(auVar176,auVar189);
  auVar189 = vshufpd_avx(auVar96,auVar96,3);
  auVar189 = vmaxps_avx(auVar96,auVar189);
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar176,auVar257);
  auVar189 = vandps_avx(auVar189,auVar257);
  auVar96 = vmaxps_avx(auVar96,auVar189);
  auVar189 = vmovshdup_avx(auVar96);
  auVar96 = vmaxss_avx(auVar189,auVar96);
  fVar200 = auVar96._0_4_ * 9.536743e-07;
  local_478._8_8_ = local_4e8;
  local_478._0_8_ = local_4e8;
  auVar262 = ZEXT1664(local_478);
  local_318._8_8_ = auVar341._0_8_;
  local_318._0_8_ = auVar341._0_8_;
  auVar343 = ZEXT1664(local_318);
  local_328._8_8_ = auVar124._0_8_;
  local_328._0_8_ = auVar124._0_8_;
  local_338._8_8_ = auVar269._0_8_;
  local_338._0_8_ = auVar269._0_8_;
  auVar274 = ZEXT1664(local_328);
  local_348._8_8_ = auVar286._0_8_;
  local_348._0_8_ = auVar286._0_8_;
  auVar292 = ZEXT1664(local_338);
  auVar301 = ZEXT1664(local_348);
  local_358._8_8_ = auVar307._0_8_;
  local_358._0_8_ = auVar307._0_8_;
  auVar313 = ZEXT1664(local_358);
  local_368._8_8_ = auVar91._0_8_;
  local_368._0_8_ = auVar91._0_8_;
  local_208 = ZEXT416((uint)fVar200);
  auVar96 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
  local_78._16_16_ = auVar96;
  local_78._0_16_ = auVar96;
  auVar92._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
  auVar92._8_4_ = auVar96._8_4_ ^ 0x80000000;
  auVar92._12_4_ = auVar96._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar92;
  local_98._0_16_ = auVar92;
  bVar75 = false;
  uVar68 = 0;
  _local_1c8 = vsubps_avx(_local_458,_local_448);
  auVar321 = ZEXT1664(local_368);
  _local_1d8 = vsubps_avx(_local_468,_local_458);
  _local_1e8 = vsubps_avx(_local_1f8,_local_468);
  _local_238 = vsubps_avx(_local_3b8,_local_378);
  _local_248 = vsubps_avx(_local_3c8,_local_388);
  _local_258 = vsubps_avx(auVar65,_local_398);
  auVar63._4_4_ = fStack_404;
  auVar63._0_4_ = local_408;
  auVar63._8_4_ = fStack_400;
  auVar63._12_4_ = fStack_3fc;
  _local_268 = vsubps_avx(auVar63,_local_3a8);
  auVar334 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar359 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_008b60dd:
  local_218 = auVar359._0_16_;
  auVar331 = auVar334._0_16_;
  auVar96 = vshufps_avx(auVar331,auVar331,0x50);
  auVar351._8_4_ = 0x3f800000;
  auVar351._0_8_ = 0x3f8000003f800000;
  auVar351._12_4_ = 0x3f800000;
  auVar354._16_4_ = 0x3f800000;
  auVar354._0_16_ = auVar351;
  auVar354._20_4_ = 0x3f800000;
  auVar354._24_4_ = 0x3f800000;
  auVar354._28_4_ = 0x3f800000;
  auVar189 = vsubps_avx(auVar351,auVar96);
  fVar200 = auVar96._0_4_;
  fVar231 = auVar96._4_4_;
  fVar225 = auVar96._8_4_;
  fVar249 = auVar96._12_4_;
  fVar227 = auVar189._0_4_;
  fVar250 = auVar189._4_4_;
  fVar229 = auVar189._8_4_;
  fVar251 = auVar189._12_4_;
  auVar191._0_4_ = auVar301._0_4_ * fVar200 + fVar227 * auVar262._0_4_;
  auVar191._4_4_ = auVar301._4_4_ * fVar231 + fVar250 * auVar262._4_4_;
  auVar191._8_4_ = auVar301._8_4_ * fVar225 + fVar229 * auVar262._8_4_;
  auVar191._12_4_ = auVar301._12_4_ * fVar249 + fVar251 * auVar262._12_4_;
  auVar159._0_4_ = auVar296._0_4_ * fVar200 + auVar343._0_4_ * fVar227;
  auVar159._4_4_ = auVar296._4_4_ * fVar231 + auVar343._4_4_ * fVar250;
  auVar159._8_4_ = auVar296._0_4_ * fVar225 + auVar343._8_4_ * fVar229;
  auVar159._12_4_ = auVar296._4_4_ * fVar249 + auVar343._12_4_ * fVar251;
  auVar270._0_4_ = auVar313._0_4_ * fVar200 + fVar227 * auVar274._0_4_;
  auVar270._4_4_ = auVar313._4_4_ * fVar231 + fVar250 * auVar274._4_4_;
  auVar270._8_4_ = auVar313._8_4_ * fVar225 + fVar229 * auVar274._8_4_;
  auVar270._12_4_ = auVar313._12_4_ * fVar249 + fVar251 * auVar274._12_4_;
  auVar213._0_4_ = auVar321._0_4_ * fVar200 + auVar292._0_4_ * fVar227;
  auVar213._4_4_ = auVar321._4_4_ * fVar231 + auVar292._4_4_ * fVar250;
  auVar213._8_4_ = auVar321._8_4_ * fVar225 + auVar292._8_4_ * fVar229;
  auVar213._12_4_ = auVar321._12_4_ * fVar249 + auVar292._12_4_ * fVar251;
  auVar96 = vmovshdup_avx(local_218);
  auVar189 = vshufps_avx(local_218,local_218,0);
  auVar299._16_16_ = auVar189;
  auVar299._0_16_ = auVar189;
  auVar176 = vshufps_avx(local_218,local_218,0x55);
  auVar108._16_16_ = auVar176;
  auVar108._0_16_ = auVar176;
  auVar144 = vsubps_avx(auVar108,auVar299);
  auVar176 = vshufps_avx(auVar191,auVar191,0);
  auVar139 = vshufps_avx(auVar191,auVar191,0x55);
  auVar127 = vshufps_avx(auVar159,auVar159,0);
  auVar162 = vshufps_avx(auVar159,auVar159,0x55);
  auVar128 = vshufps_avx(auVar270,auVar270,0);
  auVar263 = vshufps_avx(auVar270,auVar270,0x55);
  auVar20 = vshufps_avx(auVar213,auVar213,0);
  auVar19 = vshufps_avx(auVar213,auVar213,0x55);
  auVar96 = ZEXT416((uint)((auVar96._0_4_ - auVar359._0_4_) * 0.04761905));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar312._0_4_ = auVar189._0_4_ + auVar144._0_4_ * 0.0;
  auVar312._4_4_ = auVar189._4_4_ + auVar144._4_4_ * 0.14285715;
  auVar312._8_4_ = auVar189._8_4_ + auVar144._8_4_ * 0.2857143;
  auVar312._12_4_ = auVar189._12_4_ + auVar144._12_4_ * 0.42857146;
  auVar312._16_4_ = auVar189._0_4_ + auVar144._16_4_ * 0.5714286;
  auVar312._20_4_ = auVar189._4_4_ + auVar144._20_4_ * 0.71428573;
  auVar312._24_4_ = auVar189._8_4_ + auVar144._24_4_ * 0.8571429;
  auVar312._28_4_ = auVar189._12_4_ + auVar144._28_4_;
  auVar22 = vsubps_avx(auVar354,auVar312);
  fVar200 = auVar127._0_4_;
  fVar225 = auVar127._4_4_;
  fVar227 = auVar127._8_4_;
  fVar229 = auVar127._12_4_;
  fVar326 = auVar22._0_4_;
  fVar328 = auVar22._4_4_;
  fVar335 = auVar22._8_4_;
  fVar336 = auVar22._12_4_;
  fVar337 = auVar22._16_4_;
  fVar338 = auVar22._20_4_;
  fVar344 = auVar22._24_4_;
  fVar115 = auVar162._0_4_;
  fVar302 = auVar162._4_4_;
  fVar304 = auVar162._8_4_;
  fVar322 = auVar162._12_4_;
  fVar325 = auVar139._12_4_ + 1.0;
  fVar230 = auVar128._0_4_;
  fVar76 = auVar128._4_4_;
  fVar113 = auVar128._8_4_;
  fVar114 = auVar128._12_4_;
  fVar180 = fVar230 * auVar312._0_4_ + fVar326 * fVar200;
  fVar196 = fVar76 * auVar312._4_4_ + fVar328 * fVar225;
  fVar197 = fVar113 * auVar312._8_4_ + fVar335 * fVar227;
  fVar198 = fVar114 * auVar312._12_4_ + fVar336 * fVar229;
  fVar199 = fVar230 * auVar312._16_4_ + fVar337 * fVar200;
  fVar201 = fVar76 * auVar312._20_4_ + fVar338 * fVar225;
  fVar226 = fVar113 * auVar312._24_4_ + fVar344 * fVar227;
  fVar231 = auVar263._0_4_;
  fVar249 = auVar263._4_4_;
  fVar250 = auVar263._8_4_;
  fVar251 = auVar263._12_4_;
  fVar293 = fVar115 * fVar326 + auVar312._0_4_ * fVar231;
  fVar303 = fVar302 * fVar328 + auVar312._4_4_ * fVar249;
  fVar314 = fVar304 * fVar335 + auVar312._8_4_ * fVar250;
  fVar324 = fVar322 * fVar336 + auVar312._12_4_ * fVar251;
  fVar345 = fVar115 * fVar337 + auVar312._16_4_ * fVar231;
  fVar346 = fVar302 * fVar338 + auVar312._20_4_ * fVar249;
  fVar315 = fVar304 * fVar344 + auVar312._24_4_ * fVar250;
  fVar323 = fVar322 + fVar229;
  auVar189 = vshufps_avx(auVar191,auVar191,0xaa);
  auVar127 = vshufps_avx(auVar191,auVar191,0xff);
  fVar228 = fVar114 + 0.0;
  auVar162 = vshufps_avx(auVar159,auVar159,0xaa);
  auVar128 = vshufps_avx(auVar159,auVar159,0xff);
  auVar223._0_4_ =
       fVar326 * (auVar312._0_4_ * fVar200 + fVar326 * auVar176._0_4_) + auVar312._0_4_ * fVar180;
  auVar223._4_4_ =
       fVar328 * (auVar312._4_4_ * fVar225 + fVar328 * auVar176._4_4_) + auVar312._4_4_ * fVar196;
  auVar223._8_4_ =
       fVar335 * (auVar312._8_4_ * fVar227 + fVar335 * auVar176._8_4_) + auVar312._8_4_ * fVar197;
  auVar223._12_4_ =
       fVar336 * (auVar312._12_4_ * fVar229 + fVar336 * auVar176._12_4_) + auVar312._12_4_ * fVar198
  ;
  auVar223._16_4_ =
       fVar337 * (auVar312._16_4_ * fVar200 + fVar337 * auVar176._0_4_) + auVar312._16_4_ * fVar199;
  auVar223._20_4_ =
       fVar338 * (auVar312._20_4_ * fVar225 + fVar338 * auVar176._4_4_) + auVar312._20_4_ * fVar201;
  auVar223._24_4_ =
       fVar344 * (auVar312._24_4_ * fVar227 + fVar344 * auVar176._8_4_) + auVar312._24_4_ * fVar226;
  auVar223._28_4_ = auVar176._12_4_ + 1.0 + fVar251;
  auVar247._0_4_ =
       fVar326 * (fVar115 * auVar312._0_4_ + auVar139._0_4_ * fVar326) + auVar312._0_4_ * fVar293;
  auVar247._4_4_ =
       fVar328 * (fVar302 * auVar312._4_4_ + auVar139._4_4_ * fVar328) + auVar312._4_4_ * fVar303;
  auVar247._8_4_ =
       fVar335 * (fVar304 * auVar312._8_4_ + auVar139._8_4_ * fVar335) + auVar312._8_4_ * fVar314;
  auVar247._12_4_ =
       fVar336 * (fVar322 * auVar312._12_4_ + auVar139._12_4_ * fVar336) + auVar312._12_4_ * fVar324
  ;
  auVar247._16_4_ =
       fVar337 * (fVar115 * auVar312._16_4_ + auVar139._0_4_ * fVar337) + auVar312._16_4_ * fVar345;
  auVar247._20_4_ =
       fVar338 * (fVar302 * auVar312._20_4_ + auVar139._4_4_ * fVar338) + auVar312._20_4_ * fVar346;
  auVar247._24_4_ =
       fVar344 * (fVar304 * auVar312._24_4_ + auVar139._8_4_ * fVar344) + auVar312._24_4_ * fVar315;
  auVar247._28_4_ = auVar19._12_4_ + fVar251;
  auVar109._0_4_ =
       fVar326 * fVar180 + auVar312._0_4_ * (fVar230 * fVar326 + auVar20._0_4_ * auVar312._0_4_);
  auVar109._4_4_ =
       fVar328 * fVar196 + auVar312._4_4_ * (fVar76 * fVar328 + auVar20._4_4_ * auVar312._4_4_);
  auVar109._8_4_ =
       fVar335 * fVar197 + auVar312._8_4_ * (fVar113 * fVar335 + auVar20._8_4_ * auVar312._8_4_);
  auVar109._12_4_ =
       fVar336 * fVar198 + auVar312._12_4_ * (fVar114 * fVar336 + auVar20._12_4_ * auVar312._12_4_);
  auVar109._16_4_ =
       fVar337 * fVar199 + auVar312._16_4_ * (fVar230 * fVar337 + auVar20._0_4_ * auVar312._16_4_);
  auVar109._20_4_ =
       fVar338 * fVar201 + auVar312._20_4_ * (fVar76 * fVar338 + auVar20._4_4_ * auVar312._20_4_);
  auVar109._24_4_ =
       fVar344 * fVar226 + auVar312._24_4_ * (fVar113 * fVar344 + auVar20._8_4_ * auVar312._24_4_);
  auVar109._28_4_ = fVar229 + 1.0 + fVar228;
  auVar320._0_4_ =
       fVar326 * fVar293 + auVar312._0_4_ * (auVar19._0_4_ * auVar312._0_4_ + fVar326 * fVar231);
  auVar320._4_4_ =
       fVar328 * fVar303 + auVar312._4_4_ * (auVar19._4_4_ * auVar312._4_4_ + fVar328 * fVar249);
  auVar320._8_4_ =
       fVar335 * fVar314 + auVar312._8_4_ * (auVar19._8_4_ * auVar312._8_4_ + fVar335 * fVar250);
  auVar320._12_4_ =
       fVar336 * fVar324 + auVar312._12_4_ * (auVar19._12_4_ * auVar312._12_4_ + fVar336 * fVar251);
  auVar320._16_4_ =
       fVar337 * fVar345 + auVar312._16_4_ * (auVar19._0_4_ * auVar312._16_4_ + fVar337 * fVar231);
  auVar320._20_4_ =
       fVar338 * fVar346 + auVar312._20_4_ * (auVar19._4_4_ * auVar312._20_4_ + fVar338 * fVar249);
  auVar320._24_4_ =
       fVar344 * fVar315 + auVar312._24_4_ * (auVar19._8_4_ * auVar312._24_4_ + fVar344 * fVar250);
  auVar320._28_4_ = fVar228 + fVar251 + 0.0;
  local_d8._0_4_ = fVar326 * auVar223._0_4_ + auVar312._0_4_ * auVar109._0_4_;
  local_d8._4_4_ = fVar328 * auVar223._4_4_ + auVar312._4_4_ * auVar109._4_4_;
  local_d8._8_4_ = fVar335 * auVar223._8_4_ + auVar312._8_4_ * auVar109._8_4_;
  local_d8._12_4_ = fVar336 * auVar223._12_4_ + auVar312._12_4_ * auVar109._12_4_;
  local_d8._16_4_ = fVar337 * auVar223._16_4_ + auVar312._16_4_ * auVar109._16_4_;
  local_d8._20_4_ = fVar338 * auVar223._20_4_ + auVar312._20_4_ * auVar109._20_4_;
  local_d8._24_4_ = fVar344 * auVar223._24_4_ + auVar312._24_4_ * auVar109._24_4_;
  local_d8._28_4_ = fVar323 + fVar251 + 0.0;
  auVar195._0_4_ = fVar326 * auVar247._0_4_ + auVar312._0_4_ * auVar320._0_4_;
  auVar195._4_4_ = fVar328 * auVar247._4_4_ + auVar312._4_4_ * auVar320._4_4_;
  auVar195._8_4_ = fVar335 * auVar247._8_4_ + auVar312._8_4_ * auVar320._8_4_;
  auVar195._12_4_ = fVar336 * auVar247._12_4_ + auVar312._12_4_ * auVar320._12_4_;
  auVar195._16_4_ = fVar337 * auVar247._16_4_ + auVar312._16_4_ * auVar320._16_4_;
  auVar195._20_4_ = fVar338 * auVar247._20_4_ + auVar312._20_4_ * auVar320._20_4_;
  auVar195._24_4_ = fVar344 * auVar247._24_4_ + auVar312._24_4_ * auVar320._24_4_;
  auVar195._28_4_ = fVar323 + fVar228;
  auVar23 = vsubps_avx(auVar109,auVar223);
  auVar144 = vsubps_avx(auVar320,auVar247);
  local_3f8._0_4_ = auVar96._0_4_;
  local_3f8._4_4_ = auVar96._4_4_;
  fStack_3f0 = auVar96._8_4_;
  fStack_3ec = auVar96._12_4_;
  local_118 = (float)local_3f8._0_4_ * auVar23._0_4_ * 3.0;
  fStack_114 = (float)local_3f8._4_4_ * auVar23._4_4_ * 3.0;
  auVar24._4_4_ = fStack_114;
  auVar24._0_4_ = local_118;
  fStack_110 = fStack_3f0 * auVar23._8_4_ * 3.0;
  auVar24._8_4_ = fStack_110;
  fStack_10c = fStack_3ec * auVar23._12_4_ * 3.0;
  auVar24._12_4_ = fStack_10c;
  fStack_108 = (float)local_3f8._0_4_ * auVar23._16_4_ * 3.0;
  auVar24._16_4_ = fStack_108;
  fStack_104 = (float)local_3f8._4_4_ * auVar23._20_4_ * 3.0;
  auVar24._20_4_ = fStack_104;
  fStack_100 = fStack_3f0 * auVar23._24_4_ * 3.0;
  auVar24._24_4_ = fStack_100;
  auVar24._28_4_ = auVar23._28_4_;
  local_138 = (float)local_3f8._0_4_ * auVar144._0_4_ * 3.0;
  fStack_134 = (float)local_3f8._4_4_ * auVar144._4_4_ * 3.0;
  auVar25._4_4_ = fStack_134;
  auVar25._0_4_ = local_138;
  fStack_130 = fStack_3f0 * auVar144._8_4_ * 3.0;
  auVar25._8_4_ = fStack_130;
  fStack_12c = fStack_3ec * auVar144._12_4_ * 3.0;
  auVar25._12_4_ = fStack_12c;
  fStack_128 = (float)local_3f8._0_4_ * auVar144._16_4_ * 3.0;
  auVar25._16_4_ = fStack_128;
  fStack_124 = (float)local_3f8._4_4_ * auVar144._20_4_ * 3.0;
  auVar25._20_4_ = fStack_124;
  fStack_120 = fStack_3f0 * auVar144._24_4_ * 3.0;
  auVar25._24_4_ = fStack_120;
  auVar25._28_4_ = fVar323;
  auVar24 = vsubps_avx(local_d8,auVar24);
  auVar144 = vperm2f128_avx(auVar24,auVar24,1);
  auVar144 = vshufps_avx(auVar144,auVar24,0x30);
  auVar144 = vshufps_avx(auVar24,auVar144,0x29);
  auVar25 = vsubps_avx(auVar195,auVar25);
  auVar24 = vperm2f128_avx(auVar25,auVar25,1);
  auVar24 = vshufps_avx(auVar24,auVar25,0x30);
  _local_438 = vshufps_avx(auVar25,auVar24,0x29);
  fVar346 = auVar162._0_4_;
  fVar315 = auVar162._4_4_;
  fVar327 = auVar162._8_4_;
  fVar229 = auVar189._12_4_;
  fVar76 = auVar128._0_4_;
  fVar114 = auVar128._4_4_;
  fVar293 = auVar128._8_4_;
  fVar303 = auVar128._12_4_;
  auVar96 = vshufps_avx(auVar270,auVar270,0xaa);
  fVar200 = auVar96._0_4_;
  fVar225 = auVar96._4_4_;
  fVar227 = auVar96._8_4_;
  fVar251 = auVar96._12_4_;
  fVar197 = auVar312._0_4_ * fVar200 + fVar346 * fVar326;
  fVar198 = auVar312._4_4_ * fVar225 + fVar315 * fVar328;
  fVar199 = auVar312._8_4_ * fVar227 + fVar327 * fVar335;
  fVar201 = auVar312._12_4_ * fVar251 + auVar162._12_4_ * fVar336;
  fVar226 = auVar312._16_4_ * fVar200 + fVar346 * fVar337;
  fVar228 = auVar312._20_4_ * fVar225 + fVar315 * fVar338;
  fVar230 = auVar312._24_4_ * fVar227 + fVar327 * fVar344;
  auVar96 = vshufps_avx(auVar270,auVar270,0xff);
  fVar231 = auVar96._0_4_;
  fVar249 = auVar96._4_4_;
  fVar250 = auVar96._8_4_;
  fVar180 = auVar96._12_4_;
  fVar113 = auVar312._0_4_ * fVar231 + fVar76 * fVar326;
  fVar115 = auVar312._4_4_ * fVar249 + fVar114 * fVar328;
  fVar302 = auVar312._8_4_ * fVar250 + fVar293 * fVar335;
  fVar304 = auVar312._12_4_ * fVar180 + fVar303 * fVar336;
  fVar314 = auVar312._16_4_ * fVar231 + fVar76 * fVar337;
  fVar322 = auVar312._20_4_ * fVar249 + fVar114 * fVar338;
  fVar324 = auVar312._24_4_ * fVar250 + fVar293 * fVar344;
  auVar96 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar345 = auVar96._12_4_ + fVar251;
  auVar176 = vshufps_avx(auVar213,auVar213,0xff);
  fVar196 = auVar176._12_4_;
  auVar110._0_4_ =
       fVar326 * (fVar346 * auVar312._0_4_ + fVar326 * auVar189._0_4_) + auVar312._0_4_ * fVar197;
  auVar110._4_4_ =
       fVar328 * (fVar315 * auVar312._4_4_ + fVar328 * auVar189._4_4_) + auVar312._4_4_ * fVar198;
  auVar110._8_4_ =
       fVar335 * (fVar327 * auVar312._8_4_ + fVar335 * auVar189._8_4_) + auVar312._8_4_ * fVar199;
  auVar110._12_4_ =
       fVar336 * (auVar162._12_4_ * auVar312._12_4_ + fVar336 * fVar229) + auVar312._12_4_ * fVar201
  ;
  auVar110._16_4_ =
       fVar337 * (fVar346 * auVar312._16_4_ + fVar337 * auVar189._0_4_) + auVar312._16_4_ * fVar226;
  auVar110._20_4_ =
       fVar338 * (fVar315 * auVar312._20_4_ + fVar338 * auVar189._4_4_) + auVar312._20_4_ * fVar228;
  auVar110._24_4_ =
       fVar344 * (fVar327 * auVar312._24_4_ + fVar344 * auVar189._8_4_) + auVar312._24_4_ * fVar230;
  auVar110._28_4_ = local_438._28_4_ + fVar229 + fVar196;
  auVar145._0_4_ =
       fVar326 * (fVar76 * auVar312._0_4_ + auVar127._0_4_ * fVar326) + auVar312._0_4_ * fVar113;
  auVar145._4_4_ =
       fVar328 * (fVar114 * auVar312._4_4_ + auVar127._4_4_ * fVar328) + auVar312._4_4_ * fVar115;
  auVar145._8_4_ =
       fVar335 * (fVar293 * auVar312._8_4_ + auVar127._8_4_ * fVar335) + auVar312._8_4_ * fVar302;
  auVar145._12_4_ =
       fVar336 * (fVar303 * auVar312._12_4_ + auVar127._12_4_ * fVar336) + auVar312._12_4_ * fVar304
  ;
  auVar145._16_4_ =
       fVar337 * (fVar76 * auVar312._16_4_ + auVar127._0_4_ * fVar337) + auVar312._16_4_ * fVar314;
  auVar145._20_4_ =
       fVar338 * (fVar114 * auVar312._20_4_ + auVar127._4_4_ * fVar338) + auVar312._20_4_ * fVar322;
  auVar145._24_4_ =
       fVar344 * (fVar293 * auVar312._24_4_ + auVar127._8_4_ * fVar344) + auVar312._24_4_ * fVar324;
  auVar145._28_4_ = fVar229 + auVar24._28_4_ + fVar196;
  auVar24 = vperm2f128_avx(local_d8,local_d8,1);
  auVar24 = vshufps_avx(auVar24,local_d8,0x30);
  _local_308 = vshufps_avx(local_d8,auVar24,0x29);
  auVar248._0_4_ =
       auVar312._0_4_ * (auVar96._0_4_ * auVar312._0_4_ + fVar326 * fVar200) + fVar326 * fVar197;
  auVar248._4_4_ =
       auVar312._4_4_ * (auVar96._4_4_ * auVar312._4_4_ + fVar328 * fVar225) + fVar328 * fVar198;
  auVar248._8_4_ =
       auVar312._8_4_ * (auVar96._8_4_ * auVar312._8_4_ + fVar335 * fVar227) + fVar335 * fVar199;
  auVar248._12_4_ =
       auVar312._12_4_ * (auVar96._12_4_ * auVar312._12_4_ + fVar336 * fVar251) + fVar336 * fVar201;
  auVar248._16_4_ =
       auVar312._16_4_ * (auVar96._0_4_ * auVar312._16_4_ + fVar337 * fVar200) + fVar337 * fVar226;
  auVar248._20_4_ =
       auVar312._20_4_ * (auVar96._4_4_ * auVar312._20_4_ + fVar338 * fVar225) + fVar338 * fVar228;
  auVar248._24_4_ =
       auVar312._24_4_ * (auVar96._8_4_ * auVar312._24_4_ + fVar344 * fVar227) + fVar344 * fVar230;
  auVar248._28_4_ = fVar345 + fVar325 + auVar247._28_4_;
  auVar291._0_4_ =
       fVar326 * fVar113 + auVar312._0_4_ * (auVar312._0_4_ * auVar176._0_4_ + fVar326 * fVar231);
  auVar291._4_4_ =
       fVar328 * fVar115 + auVar312._4_4_ * (auVar312._4_4_ * auVar176._4_4_ + fVar328 * fVar249);
  auVar291._8_4_ =
       fVar335 * fVar302 + auVar312._8_4_ * (auVar312._8_4_ * auVar176._8_4_ + fVar335 * fVar250);
  auVar291._12_4_ =
       fVar336 * fVar304 + auVar312._12_4_ * (auVar312._12_4_ * fVar196 + fVar336 * fVar180);
  auVar291._16_4_ =
       fVar337 * fVar314 + auVar312._16_4_ * (auVar312._16_4_ * auVar176._0_4_ + fVar337 * fVar231);
  auVar291._20_4_ =
       fVar338 * fVar322 + auVar312._20_4_ * (auVar312._20_4_ * auVar176._4_4_ + fVar338 * fVar249);
  auVar291._24_4_ =
       fVar344 * fVar324 + auVar312._24_4_ * (auVar312._24_4_ * auVar176._8_4_ + fVar344 * fVar250);
  auVar291._28_4_ = fVar325 + fVar303 + fVar196 + fVar180;
  auVar273._0_4_ = fVar326 * auVar110._0_4_ + auVar312._0_4_ * auVar248._0_4_;
  auVar273._4_4_ = fVar328 * auVar110._4_4_ + auVar312._4_4_ * auVar248._4_4_;
  auVar273._8_4_ = fVar335 * auVar110._8_4_ + auVar312._8_4_ * auVar248._8_4_;
  auVar273._12_4_ = fVar336 * auVar110._12_4_ + auVar312._12_4_ * auVar248._12_4_;
  auVar273._16_4_ = fVar337 * auVar110._16_4_ + auVar312._16_4_ * auVar248._16_4_;
  auVar273._20_4_ = fVar338 * auVar110._20_4_ + auVar312._20_4_ * auVar248._20_4_;
  auVar273._24_4_ = fVar344 * auVar110._24_4_ + auVar312._24_4_ * auVar248._24_4_;
  auVar273._28_4_ = fVar345 + fVar196 + fVar180;
  auVar300._0_4_ = fVar326 * auVar145._0_4_ + auVar312._0_4_ * auVar291._0_4_;
  auVar300._4_4_ = fVar328 * auVar145._4_4_ + auVar312._4_4_ * auVar291._4_4_;
  auVar300._8_4_ = fVar335 * auVar145._8_4_ + auVar312._8_4_ * auVar291._8_4_;
  auVar300._12_4_ = fVar336 * auVar145._12_4_ + auVar312._12_4_ * auVar291._12_4_;
  auVar300._16_4_ = fVar337 * auVar145._16_4_ + auVar312._16_4_ * auVar291._16_4_;
  auVar300._20_4_ = fVar338 * auVar145._20_4_ + auVar312._20_4_ * auVar291._20_4_;
  auVar300._24_4_ = fVar344 * auVar145._24_4_ + auVar312._24_4_ * auVar291._24_4_;
  auVar300._28_4_ = auVar22._28_4_ + auVar312._28_4_;
  auVar22 = vsubps_avx(auVar248,auVar110);
  auVar24 = vsubps_avx(auVar291,auVar145);
  local_158 = (float)local_3f8._0_4_ * auVar22._0_4_ * 3.0;
  fStack_154 = (float)local_3f8._4_4_ * auVar22._4_4_ * 3.0;
  auVar26._4_4_ = fStack_154;
  auVar26._0_4_ = local_158;
  fStack_150 = fStack_3f0 * auVar22._8_4_ * 3.0;
  auVar26._8_4_ = fStack_150;
  fStack_14c = fStack_3ec * auVar22._12_4_ * 3.0;
  auVar26._12_4_ = fStack_14c;
  fStack_148 = (float)local_3f8._0_4_ * auVar22._16_4_ * 3.0;
  auVar26._16_4_ = fStack_148;
  fStack_144 = (float)local_3f8._4_4_ * auVar22._20_4_ * 3.0;
  auVar26._20_4_ = fStack_144;
  fStack_140 = fStack_3f0 * auVar22._24_4_ * 3.0;
  auVar26._24_4_ = fStack_140;
  auVar26._28_4_ = auVar22._28_4_;
  local_178 = (float)local_3f8._0_4_ * auVar24._0_4_ * 3.0;
  fStack_174 = (float)local_3f8._4_4_ * auVar24._4_4_ * 3.0;
  auVar27._4_4_ = fStack_174;
  auVar27._0_4_ = local_178;
  fStack_170 = fStack_3f0 * auVar24._8_4_ * 3.0;
  auVar27._8_4_ = fStack_170;
  fStack_16c = fStack_3ec * auVar24._12_4_ * 3.0;
  auVar27._12_4_ = fStack_16c;
  fStack_168 = (float)local_3f8._0_4_ * auVar24._16_4_ * 3.0;
  auVar27._16_4_ = fStack_168;
  fStack_164 = (float)local_3f8._4_4_ * auVar24._20_4_ * 3.0;
  auVar27._20_4_ = fStack_164;
  fStack_160 = fStack_3f0 * auVar24._24_4_ * 3.0;
  auVar27._24_4_ = fStack_160;
  auVar27._28_4_ = auVar248._28_4_;
  auVar24 = vperm2f128_avx(auVar273,auVar273,1);
  auVar24 = vshufps_avx(auVar24,auVar273,0x30);
  auVar108 = vshufps_avx(auVar273,auVar24,0x29);
  auVar25 = vsubps_avx(auVar273,auVar26);
  auVar24 = vperm2f128_avx(auVar25,auVar25,1);
  auVar24 = vshufps_avx(auVar24,auVar25,0x30);
  _local_3f8 = vshufps_avx(auVar25,auVar24,0x29);
  auVar25 = vsubps_avx(auVar300,auVar27);
  auVar24 = vperm2f128_avx(auVar25,auVar25,1);
  auVar24 = vshufps_avx(auVar24,auVar25,0x30);
  local_b8 = vshufps_avx(auVar25,auVar24,0x29);
  auVar25 = vsubps_avx(auVar273,local_d8);
  auVar26 = vsubps_avx(auVar108,_local_308);
  fVar200 = auVar26._0_4_ + auVar25._0_4_;
  fVar231 = auVar26._4_4_ + auVar25._4_4_;
  fVar225 = auVar26._8_4_ + auVar25._8_4_;
  fVar249 = auVar26._12_4_ + auVar25._12_4_;
  fVar227 = auVar26._16_4_ + auVar25._16_4_;
  fVar250 = auVar26._20_4_ + auVar25._20_4_;
  fVar229 = auVar26._24_4_ + auVar25._24_4_;
  auVar24 = vperm2f128_avx(auVar195,auVar195,1);
  auVar24 = vshufps_avx(auVar24,auVar195,0x30);
  local_f8 = vshufps_avx(auVar195,auVar24,0x29);
  auVar24 = vperm2f128_avx(auVar300,auVar300,1);
  auVar24 = vshufps_avx(auVar24,auVar300,0x30);
  _local_498 = vshufps_avx(auVar300,auVar24,0x29);
  auVar24 = vsubps_avx(auVar300,auVar195);
  auVar27 = vsubps_avx(_local_498,local_f8);
  fVar251 = auVar27._0_4_ + auVar24._0_4_;
  fVar180 = auVar27._4_4_ + auVar24._4_4_;
  fVar196 = auVar27._8_4_ + auVar24._8_4_;
  fVar197 = auVar27._12_4_ + auVar24._12_4_;
  fVar198 = auVar27._16_4_ + auVar24._16_4_;
  fVar199 = auVar27._20_4_ + auVar24._20_4_;
  fVar201 = auVar27._24_4_ + auVar24._24_4_;
  auVar28._4_4_ = fVar231 * auVar195._4_4_;
  auVar28._0_4_ = fVar200 * auVar195._0_4_;
  auVar28._8_4_ = fVar225 * auVar195._8_4_;
  auVar28._12_4_ = fVar249 * auVar195._12_4_;
  auVar28._16_4_ = fVar227 * auVar195._16_4_;
  auVar28._20_4_ = fVar250 * auVar195._20_4_;
  auVar28._24_4_ = fVar229 * auVar195._24_4_;
  auVar28._28_4_ = auVar24._28_4_;
  auVar29._4_4_ = fVar180 * local_d8._4_4_;
  auVar29._0_4_ = fVar251 * local_d8._0_4_;
  auVar29._8_4_ = fVar196 * local_d8._8_4_;
  auVar29._12_4_ = fVar197 * local_d8._12_4_;
  auVar29._16_4_ = fVar198 * local_d8._16_4_;
  auVar29._20_4_ = fVar199 * local_d8._20_4_;
  auVar29._24_4_ = fVar201 * local_d8._24_4_;
  auVar29._28_4_ = fVar345;
  auVar28 = vsubps_avx(auVar28,auVar29);
  local_118 = local_d8._0_4_ + local_118;
  fStack_114 = local_d8._4_4_ + fStack_114;
  fStack_110 = local_d8._8_4_ + fStack_110;
  fStack_10c = local_d8._12_4_ + fStack_10c;
  fStack_108 = local_d8._16_4_ + fStack_108;
  fStack_104 = local_d8._20_4_ + fStack_104;
  fStack_100 = local_d8._24_4_ + fStack_100;
  fStack_fc = local_d8._28_4_ + auVar23._28_4_;
  local_138 = local_138 + auVar195._0_4_;
  fStack_134 = fStack_134 + auVar195._4_4_;
  fStack_130 = fStack_130 + auVar195._8_4_;
  fStack_12c = fStack_12c + auVar195._12_4_;
  fStack_128 = fStack_128 + auVar195._16_4_;
  fStack_124 = fStack_124 + auVar195._20_4_;
  fStack_120 = fStack_120 + auVar195._24_4_;
  fStack_11c = fVar323 + auVar195._28_4_;
  auVar23._4_4_ = fVar231 * fStack_134;
  auVar23._0_4_ = fVar200 * local_138;
  auVar23._8_4_ = fVar225 * fStack_130;
  auVar23._12_4_ = fVar249 * fStack_12c;
  auVar23._16_4_ = fVar227 * fStack_128;
  auVar23._20_4_ = fVar250 * fStack_124;
  auVar23._24_4_ = fVar229 * fStack_120;
  auVar23._28_4_ = fVar323;
  auVar30._4_4_ = fVar180 * fStack_114;
  auVar30._0_4_ = fVar251 * local_118;
  auVar30._8_4_ = fVar196 * fStack_110;
  auVar30._12_4_ = fVar197 * fStack_10c;
  auVar30._16_4_ = fVar198 * fStack_108;
  auVar30._20_4_ = fVar199 * fStack_104;
  auVar30._24_4_ = fVar201 * fStack_100;
  auVar30._28_4_ = fVar323 + auVar195._28_4_;
  auVar23 = vsubps_avx(auVar23,auVar30);
  auVar31._4_4_ = fVar231 * (float)local_438._4_4_;
  auVar31._0_4_ = fVar200 * (float)local_438._0_4_;
  auVar31._8_4_ = fVar225 * fStack_430;
  auVar31._12_4_ = fVar249 * fStack_42c;
  auVar31._16_4_ = fVar227 * fStack_428;
  auVar31._20_4_ = fVar250 * fStack_424;
  auVar31._24_4_ = fVar229 * fStack_420;
  auVar31._28_4_ = fVar323;
  local_4c8._0_4_ = auVar144._0_4_;
  local_4c8._4_4_ = auVar144._4_4_;
  fStack_4c0 = auVar144._8_4_;
  fStack_4bc = auVar144._12_4_;
  fStack_4b8 = auVar144._16_4_;
  fStack_4b4 = auVar144._20_4_;
  fStack_4b0 = auVar144._24_4_;
  auVar32._4_4_ = fVar180 * (float)local_4c8._4_4_;
  auVar32._0_4_ = fVar251 * (float)local_4c8._0_4_;
  auVar32._8_4_ = fVar196 * fStack_4c0;
  auVar32._12_4_ = fVar197 * fStack_4bc;
  auVar32._16_4_ = fVar198 * fStack_4b8;
  auVar32._20_4_ = fVar199 * fStack_4b4;
  auVar32._24_4_ = fVar201 * fStack_4b0;
  auVar32._28_4_ = local_d8._28_4_;
  auVar29 = vsubps_avx(auVar31,auVar32);
  auVar33._4_4_ = local_f8._4_4_ * fVar231;
  auVar33._0_4_ = local_f8._0_4_ * fVar200;
  auVar33._8_4_ = local_f8._8_4_ * fVar225;
  auVar33._12_4_ = local_f8._12_4_ * fVar249;
  auVar33._16_4_ = local_f8._16_4_ * fVar227;
  auVar33._20_4_ = local_f8._20_4_ * fVar250;
  auVar33._24_4_ = local_f8._24_4_ * fVar229;
  auVar33._28_4_ = fVar323;
  auVar34._4_4_ = local_308._4_4_ * fVar180;
  auVar34._0_4_ = local_308._0_4_ * fVar251;
  auVar34._8_4_ = local_308._8_4_ * fVar196;
  auVar34._12_4_ = local_308._12_4_ * fVar197;
  auVar34._16_4_ = local_308._16_4_ * fVar198;
  auVar34._20_4_ = local_308._20_4_ * fVar199;
  auVar34._24_4_ = local_308._24_4_ * fVar201;
  auVar34._28_4_ = local_f8._28_4_;
  auVar30 = vsubps_avx(auVar33,auVar34);
  auVar35._4_4_ = auVar300._4_4_ * fVar231;
  auVar35._0_4_ = auVar300._0_4_ * fVar200;
  auVar35._8_4_ = auVar300._8_4_ * fVar225;
  auVar35._12_4_ = auVar300._12_4_ * fVar249;
  auVar35._16_4_ = auVar300._16_4_ * fVar227;
  auVar35._20_4_ = auVar300._20_4_ * fVar250;
  auVar35._24_4_ = auVar300._24_4_ * fVar229;
  auVar35._28_4_ = fVar323;
  auVar36._4_4_ = fVar180 * auVar273._4_4_;
  auVar36._0_4_ = fVar251 * auVar273._0_4_;
  auVar36._8_4_ = fVar196 * auVar273._8_4_;
  auVar36._12_4_ = fVar197 * auVar273._12_4_;
  auVar36._16_4_ = fVar198 * auVar273._16_4_;
  auVar36._20_4_ = fVar199 * auVar273._20_4_;
  auVar36._24_4_ = fVar201 * auVar273._24_4_;
  auVar36._28_4_ = fStack_fc;
  auVar31 = vsubps_avx(auVar35,auVar36);
  local_158 = auVar273._0_4_ + local_158;
  fStack_154 = auVar273._4_4_ + fStack_154;
  fStack_150 = auVar273._8_4_ + fStack_150;
  fStack_14c = auVar273._12_4_ + fStack_14c;
  fStack_148 = auVar273._16_4_ + fStack_148;
  fStack_144 = auVar273._20_4_ + fStack_144;
  fStack_140 = auVar273._24_4_ + fStack_140;
  fStack_13c = auVar273._28_4_ + auVar22._28_4_;
  local_178 = auVar300._0_4_ + local_178;
  fStack_174 = auVar300._4_4_ + fStack_174;
  fStack_170 = auVar300._8_4_ + fStack_170;
  fStack_16c = auVar300._12_4_ + fStack_16c;
  fStack_168 = auVar300._16_4_ + fStack_168;
  fStack_164 = auVar300._20_4_ + fStack_164;
  fStack_160 = auVar300._24_4_ + fStack_160;
  fStack_15c = auVar300._28_4_ + auVar248._28_4_;
  auVar22._4_4_ = fVar231 * fStack_174;
  auVar22._0_4_ = fVar200 * local_178;
  auVar22._8_4_ = fVar225 * fStack_170;
  auVar22._12_4_ = fVar249 * fStack_16c;
  auVar22._16_4_ = fVar227 * fStack_168;
  auVar22._20_4_ = fVar250 * fStack_164;
  auVar22._24_4_ = fVar229 * fStack_160;
  auVar22._28_4_ = auVar300._28_4_ + auVar248._28_4_;
  auVar37._4_4_ = fStack_154 * fVar180;
  auVar37._0_4_ = local_158 * fVar251;
  auVar37._8_4_ = fStack_150 * fVar196;
  auVar37._12_4_ = fStack_14c * fVar197;
  auVar37._16_4_ = fStack_148 * fVar198;
  auVar37._20_4_ = fStack_144 * fVar199;
  auVar37._24_4_ = fStack_140 * fVar201;
  auVar37._28_4_ = fStack_13c;
  auVar32 = vsubps_avx(auVar22,auVar37);
  auVar38._4_4_ = fVar231 * local_b8._4_4_;
  auVar38._0_4_ = fVar200 * local_b8._0_4_;
  auVar38._8_4_ = fVar225 * local_b8._8_4_;
  auVar38._12_4_ = fVar249 * local_b8._12_4_;
  auVar38._16_4_ = fVar227 * local_b8._16_4_;
  auVar38._20_4_ = fVar250 * local_b8._20_4_;
  auVar38._24_4_ = fVar229 * local_b8._24_4_;
  auVar38._28_4_ = fStack_13c;
  auVar39._4_4_ = fVar180 * (float)local_3f8._4_4_;
  auVar39._0_4_ = fVar251 * (float)local_3f8._0_4_;
  auVar39._8_4_ = fVar196 * fStack_3f0;
  auVar39._12_4_ = fVar197 * fStack_3ec;
  auVar39._16_4_ = fVar198 * fStack_3e8;
  auVar39._20_4_ = fVar199 * fStack_3e4;
  auVar39._24_4_ = fVar201 * fStack_3e0;
  auVar39._28_4_ = local_b8._28_4_;
  auVar33 = vsubps_avx(auVar38,auVar39);
  auVar40._4_4_ = fVar231 * local_498._4_4_;
  auVar40._0_4_ = fVar200 * local_498._0_4_;
  auVar40._8_4_ = fVar225 * local_498._8_4_;
  auVar40._12_4_ = fVar249 * local_498._12_4_;
  auVar40._16_4_ = fVar227 * local_498._16_4_;
  auVar40._20_4_ = fVar250 * local_498._20_4_;
  auVar40._24_4_ = fVar229 * local_498._24_4_;
  auVar40._28_4_ = auVar26._28_4_ + auVar25._28_4_;
  auVar41._4_4_ = auVar108._4_4_ * fVar180;
  auVar41._0_4_ = auVar108._0_4_ * fVar251;
  auVar41._8_4_ = auVar108._8_4_ * fVar196;
  auVar41._12_4_ = auVar108._12_4_ * fVar197;
  auVar41._16_4_ = auVar108._16_4_ * fVar198;
  auVar41._20_4_ = auVar108._20_4_ * fVar199;
  auVar41._24_4_ = auVar108._24_4_ * fVar201;
  auVar41._28_4_ = auVar27._28_4_ + auVar24._28_4_;
  auVar26 = vsubps_avx(auVar40,auVar41);
  auVar24 = vminps_avx(auVar28,auVar23);
  auVar144 = vmaxps_avx(auVar28,auVar23);
  auVar22 = vminps_avx(auVar29,auVar30);
  auVar22 = vminps_avx(auVar24,auVar22);
  auVar24 = vmaxps_avx(auVar29,auVar30);
  auVar144 = vmaxps_avx(auVar144,auVar24);
  auVar23 = vminps_avx(auVar31,auVar32);
  auVar24 = vmaxps_avx(auVar31,auVar32);
  auVar25 = vminps_avx(auVar33,auVar26);
  auVar25 = vminps_avx(auVar23,auVar25);
  auVar25 = vminps_avx(auVar22,auVar25);
  auVar22 = vmaxps_avx(auVar33,auVar26);
  auVar24 = vmaxps_avx(auVar24,auVar22);
  auVar24 = vmaxps_avx(auVar144,auVar24);
  auVar144 = vcmpps_avx(auVar25,local_78,2);
  auVar24 = vcmpps_avx(auVar24,local_98,5);
  auVar144 = vandps_avx(auVar24,auVar144);
  auVar24 = local_198 & auVar144;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar24 = vsubps_avx(_local_308,local_d8);
    auVar22 = vsubps_avx(auVar108,auVar273);
    fVar231 = auVar24._0_4_ + auVar22._0_4_;
    fVar225 = auVar24._4_4_ + auVar22._4_4_;
    fVar249 = auVar24._8_4_ + auVar22._8_4_;
    fVar227 = auVar24._12_4_ + auVar22._12_4_;
    fVar250 = auVar24._16_4_ + auVar22._16_4_;
    fVar229 = auVar24._20_4_ + auVar22._20_4_;
    fVar251 = auVar24._24_4_ + auVar22._24_4_;
    auVar25 = vsubps_avx(local_f8,auVar195);
    auVar26 = vsubps_avx(_local_498,auVar300);
    fVar180 = auVar25._0_4_ + auVar26._0_4_;
    fVar196 = auVar25._4_4_ + auVar26._4_4_;
    fVar197 = auVar25._8_4_ + auVar26._8_4_;
    fVar198 = auVar25._12_4_ + auVar26._12_4_;
    fVar199 = auVar25._16_4_ + auVar26._16_4_;
    fVar201 = auVar25._20_4_ + auVar26._20_4_;
    fVar226 = auVar25._24_4_ + auVar26._24_4_;
    fVar200 = auVar26._28_4_;
    auVar42._4_4_ = auVar195._4_4_ * fVar225;
    auVar42._0_4_ = auVar195._0_4_ * fVar231;
    auVar42._8_4_ = auVar195._8_4_ * fVar249;
    auVar42._12_4_ = auVar195._12_4_ * fVar227;
    auVar42._16_4_ = auVar195._16_4_ * fVar250;
    auVar42._20_4_ = auVar195._20_4_ * fVar229;
    auVar42._24_4_ = auVar195._24_4_ * fVar251;
    auVar42._28_4_ = auVar195._28_4_;
    auVar43._4_4_ = local_d8._4_4_ * fVar196;
    auVar43._0_4_ = local_d8._0_4_ * fVar180;
    auVar43._8_4_ = local_d8._8_4_ * fVar197;
    auVar43._12_4_ = local_d8._12_4_ * fVar198;
    auVar43._16_4_ = local_d8._16_4_ * fVar199;
    auVar43._20_4_ = local_d8._20_4_ * fVar201;
    auVar43._24_4_ = local_d8._24_4_ * fVar226;
    auVar43._28_4_ = local_d8._28_4_;
    auVar26 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = fVar225 * fStack_134;
    auVar44._0_4_ = fVar231 * local_138;
    auVar44._8_4_ = fVar249 * fStack_130;
    auVar44._12_4_ = fVar227 * fStack_12c;
    auVar44._16_4_ = fVar250 * fStack_128;
    auVar44._20_4_ = fVar229 * fStack_124;
    auVar44._24_4_ = fVar251 * fStack_120;
    auVar44._28_4_ = auVar195._28_4_;
    auVar45._4_4_ = fVar196 * fStack_114;
    auVar45._0_4_ = fVar180 * local_118;
    auVar45._8_4_ = fVar197 * fStack_110;
    auVar45._12_4_ = fVar198 * fStack_10c;
    auVar45._16_4_ = fVar199 * fStack_108;
    auVar45._20_4_ = fVar201 * fStack_104;
    auVar45._24_4_ = fVar226 * fStack_100;
    auVar45._28_4_ = fVar200;
    auVar27 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar225 * (float)local_438._4_4_;
    auVar46._0_4_ = fVar231 * (float)local_438._0_4_;
    auVar46._8_4_ = fVar249 * fStack_430;
    auVar46._12_4_ = fVar227 * fStack_42c;
    auVar46._16_4_ = fVar250 * fStack_428;
    auVar46._20_4_ = fVar229 * fStack_424;
    auVar46._24_4_ = fVar251 * fStack_420;
    auVar46._28_4_ = fVar200;
    auVar47._4_4_ = fVar196 * (float)local_4c8._4_4_;
    auVar47._0_4_ = fVar180 * (float)local_4c8._0_4_;
    auVar47._8_4_ = fVar197 * fStack_4c0;
    auVar47._12_4_ = fVar198 * fStack_4bc;
    auVar47._16_4_ = fVar199 * fStack_4b8;
    auVar47._20_4_ = fVar201 * fStack_4b4;
    auVar47._24_4_ = fVar226 * fStack_4b0;
    auVar47._28_4_ = auVar23._28_4_;
    auVar28 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = local_f8._4_4_ * fVar225;
    auVar48._0_4_ = local_f8._0_4_ * fVar231;
    auVar48._8_4_ = local_f8._8_4_ * fVar249;
    auVar48._12_4_ = local_f8._12_4_ * fVar227;
    auVar48._16_4_ = local_f8._16_4_ * fVar250;
    auVar48._20_4_ = local_f8._20_4_ * fVar229;
    auVar48._24_4_ = local_f8._24_4_ * fVar251;
    auVar48._28_4_ = auVar23._28_4_;
    auVar49._4_4_ = local_308._4_4_ * fVar196;
    auVar49._0_4_ = local_308._0_4_ * fVar180;
    auVar49._8_4_ = local_308._8_4_ * fVar197;
    auVar49._12_4_ = local_308._12_4_ * fVar198;
    auVar49._16_4_ = local_308._16_4_ * fVar199;
    auVar49._20_4_ = local_308._20_4_ * fVar201;
    uVar8 = local_308._28_4_;
    auVar49._24_4_ = local_308._24_4_ * fVar226;
    auVar49._28_4_ = uVar8;
    auVar29 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = auVar300._4_4_ * fVar225;
    auVar50._0_4_ = auVar300._0_4_ * fVar231;
    auVar50._8_4_ = auVar300._8_4_ * fVar249;
    auVar50._12_4_ = auVar300._12_4_ * fVar227;
    auVar50._16_4_ = auVar300._16_4_ * fVar250;
    auVar50._20_4_ = auVar300._20_4_ * fVar229;
    auVar50._24_4_ = auVar300._24_4_ * fVar251;
    auVar50._28_4_ = uVar8;
    auVar51._4_4_ = auVar273._4_4_ * fVar196;
    auVar51._0_4_ = auVar273._0_4_ * fVar180;
    auVar51._8_4_ = auVar273._8_4_ * fVar197;
    auVar51._12_4_ = auVar273._12_4_ * fVar198;
    auVar51._16_4_ = auVar273._16_4_ * fVar199;
    auVar51._20_4_ = auVar273._20_4_ * fVar201;
    auVar51._24_4_ = auVar273._24_4_ * fVar226;
    auVar51._28_4_ = auVar273._28_4_;
    auVar30 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = fVar225 * fStack_174;
    auVar52._0_4_ = fVar231 * local_178;
    auVar52._8_4_ = fVar249 * fStack_170;
    auVar52._12_4_ = fVar227 * fStack_16c;
    auVar52._16_4_ = fVar250 * fStack_168;
    auVar52._20_4_ = fVar229 * fStack_164;
    auVar52._24_4_ = fVar251 * fStack_160;
    auVar52._28_4_ = uVar8;
    auVar53._4_4_ = fVar196 * fStack_154;
    auVar53._0_4_ = fVar180 * local_158;
    auVar53._8_4_ = fVar197 * fStack_150;
    auVar53._12_4_ = fVar198 * fStack_14c;
    auVar53._16_4_ = fVar199 * fStack_148;
    auVar53._20_4_ = fVar201 * fStack_144;
    auVar53._24_4_ = fVar226 * fStack_140;
    auVar53._28_4_ = auVar300._28_4_;
    auVar31 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = fVar225 * local_b8._4_4_;
    auVar54._0_4_ = fVar231 * local_b8._0_4_;
    auVar54._8_4_ = fVar249 * local_b8._8_4_;
    auVar54._12_4_ = fVar227 * local_b8._12_4_;
    auVar54._16_4_ = fVar250 * local_b8._16_4_;
    auVar54._20_4_ = fVar229 * local_b8._20_4_;
    auVar54._24_4_ = fVar251 * local_b8._24_4_;
    auVar54._28_4_ = auVar300._28_4_;
    auVar55._4_4_ = (float)local_3f8._4_4_ * fVar196;
    auVar55._0_4_ = (float)local_3f8._0_4_ * fVar180;
    auVar55._8_4_ = fStack_3f0 * fVar197;
    auVar55._12_4_ = fStack_3ec * fVar198;
    auVar55._16_4_ = fStack_3e8 * fVar199;
    auVar55._20_4_ = fStack_3e4 * fVar201;
    auVar55._24_4_ = fStack_3e0 * fVar226;
    auVar55._28_4_ = local_f8._28_4_;
    auVar32 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar225 * local_498._4_4_;
    auVar56._0_4_ = fVar231 * local_498._0_4_;
    auVar56._8_4_ = fVar249 * local_498._8_4_;
    auVar56._12_4_ = fVar227 * local_498._12_4_;
    auVar56._16_4_ = fVar250 * local_498._16_4_;
    auVar56._20_4_ = fVar229 * local_498._20_4_;
    auVar56._24_4_ = fVar251 * local_498._24_4_;
    auVar56._28_4_ = auVar24._28_4_ + auVar22._28_4_;
    auVar57._4_4_ = auVar108._4_4_ * fVar196;
    auVar57._0_4_ = auVar108._0_4_ * fVar180;
    auVar57._8_4_ = auVar108._8_4_ * fVar197;
    auVar57._12_4_ = auVar108._12_4_ * fVar198;
    auVar57._16_4_ = auVar108._16_4_ * fVar199;
    auVar57._20_4_ = auVar108._20_4_ * fVar201;
    auVar57._24_4_ = auVar108._24_4_ * fVar226;
    auVar57._28_4_ = auVar25._28_4_ + fVar200;
    auVar33 = vsubps_avx(auVar56,auVar57);
    auVar22 = vminps_avx(auVar26,auVar27);
    auVar24 = vmaxps_avx(auVar26,auVar27);
    auVar23 = vminps_avx(auVar28,auVar29);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar28,auVar29);
    auVar24 = vmaxps_avx(auVar24,auVar22);
    auVar25 = vminps_avx(auVar30,auVar31);
    auVar22 = vmaxps_avx(auVar30,auVar31);
    auVar108 = vminps_avx(auVar32,auVar33);
    auVar25 = vminps_avx(auVar25,auVar108);
    auVar25 = vminps_avx(auVar23,auVar25);
    auVar23 = vmaxps_avx(auVar32,auVar33);
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar24,auVar22);
    auVar24 = vcmpps_avx(auVar25,local_78,2);
    auVar22 = vcmpps_avx(auVar22,local_98,5);
    auVar24 = vandps_avx(auVar22,auVar24);
    auVar144 = vandps_avx(local_198,auVar144);
    auVar22 = auVar144 & auVar24;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar144 = vandps_avx(auVar24,auVar144);
      uVar67 = vmovmskps_avx(auVar144);
      if (uVar67 != 0) {
        auStack_2a8[uVar68] = uVar67 & 0xff;
        uVar9 = vmovlps_avx(local_218);
        *(undefined8 *)(afStack_1b8 + uVar68 * 2) = uVar9;
        uVar10 = vmovlps_avx(auVar331);
        auStack_58[uVar68] = uVar10;
        uVar68 = (ulong)((int)uVar68 + 1);
      }
    }
  }
LAB_008b6737:
  do {
    do {
      do {
        do {
          if ((int)uVar68 == 0) {
            auVar59 = ZEXT812(0) << 0x20;
            if (bVar75) goto LAB_008b76a0;
            fVar200 = ray->tfar;
            auVar107._4_4_ = fVar200;
            auVar107._0_4_ = fVar200;
            auVar107._8_4_ = fVar200;
            auVar107._12_4_ = fVar200;
            auVar96 = vcmpps_avx(local_228,auVar107,2);
            uVar67 = vmovmskps_avx(auVar96);
            uVar73 = uVar73 & uVar73 + 0xf & uVar67;
            goto LAB_008b5572;
          }
          uVar69 = (int)uVar68 - 1;
          uVar70 = (ulong)uVar69;
          uVar67 = auStack_2a8[uVar70];
          fVar200 = afStack_1b8[uVar70 * 2];
          fVar231 = afStack_1b8[uVar70 * 2 + 1];
          auVar332._8_8_ = 0;
          auVar332._0_8_ = auStack_58[uVar70];
          auVar334 = ZEXT1664(auVar332);
          uVar10 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar67 = uVar67 - 1 & uVar67;
          auStack_2a8[uVar70] = uVar67;
          if (uVar67 == 0) {
            uVar68 = (ulong)uVar69;
          }
          auVar262 = ZEXT1664(local_478);
          auVar343 = ZEXT1664(local_318);
          auVar274 = ZEXT1664(local_328);
          auVar292 = ZEXT1664(local_338);
          auVar301 = ZEXT1664(local_348);
          auVar313 = ZEXT1664(local_358);
          auVar321 = ZEXT1664(local_368);
          fVar249 = (float)(uVar10 + 1) * 0.14285715;
          fVar225 = (1.0 - (float)uVar10 * 0.14285715) * fVar200 +
                    fVar231 * (float)uVar10 * 0.14285715;
          fVar200 = (1.0 - fVar249) * fVar200 + fVar231 * fVar249;
          fVar231 = fVar200 - fVar225;
          if (0.16666667 <= fVar231) {
            auVar96 = vinsertps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar200),0x10);
            auVar359 = ZEXT1664(auVar96);
            goto LAB_008b60dd;
          }
          auVar96 = vshufps_avx(auVar332,auVar332,0x50);
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = 0x3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar189 = vsubps_avx(auVar125,auVar96);
          fVar249 = auVar96._0_4_;
          fVar227 = auVar96._4_4_;
          fVar250 = auVar96._8_4_;
          fVar229 = auVar96._12_4_;
          fVar251 = auVar189._0_4_;
          fVar180 = auVar189._4_4_;
          fVar196 = auVar189._8_4_;
          fVar197 = auVar189._12_4_;
          auVar160._0_4_ = local_348._0_4_ * fVar249 + fVar251 * local_478._0_4_;
          auVar160._4_4_ = local_348._4_4_ * fVar227 + fVar180 * local_478._4_4_;
          auVar160._8_4_ = local_348._8_4_ * fVar250 + fVar196 * local_478._8_4_;
          auVar160._12_4_ = local_348._12_4_ * fVar229 + fVar197 * local_478._12_4_;
          auVar214._0_4_ = fVar249 * auVar296._0_4_ + local_318._0_4_ * fVar251;
          auVar214._4_4_ = fVar227 * auVar296._4_4_ + local_318._4_4_ * fVar180;
          auVar214._8_4_ = fVar250 * auVar296._0_4_ + local_318._8_4_ * fVar196;
          auVar214._12_4_ = fVar229 * auVar296._4_4_ + local_318._12_4_ * fVar197;
          auVar241._0_4_ = local_358._0_4_ * fVar249 + fVar251 * local_328._0_4_;
          auVar241._4_4_ = local_358._4_4_ * fVar227 + fVar180 * local_328._4_4_;
          auVar241._8_4_ = local_358._8_4_ * fVar250 + fVar196 * local_328._8_4_;
          auVar241._12_4_ = local_358._12_4_ * fVar229 + fVar197 * local_328._12_4_;
          auVar93._0_4_ = local_368._0_4_ * fVar249 + local_338._0_4_ * fVar251;
          auVar93._4_4_ = local_368._4_4_ * fVar227 + local_338._4_4_ * fVar180;
          auVar93._8_4_ = local_368._8_4_ * fVar250 + local_338._8_4_ * fVar196;
          auVar93._12_4_ = local_368._12_4_ * fVar229 + local_338._12_4_ * fVar197;
          auVar146._16_16_ = auVar160;
          auVar146._0_16_ = auVar160;
          auVar178._16_16_ = auVar214;
          auVar178._0_16_ = auVar214;
          auVar224._16_16_ = auVar241;
          auVar224._0_16_ = auVar241;
          _local_438 = ZEXT416((uint)fVar200);
          auVar144 = ZEXT2032(CONCAT416(fVar200,ZEXT416((uint)fVar225)));
          auVar144 = vshufps_avx(auVar144,auVar144,0);
          auVar24 = vsubps_avx(auVar178,auVar146);
          fVar249 = auVar144._0_4_;
          fVar227 = auVar144._4_4_;
          fVar250 = auVar144._8_4_;
          fVar229 = auVar144._12_4_;
          fVar251 = auVar144._16_4_;
          fVar180 = auVar144._20_4_;
          fVar196 = auVar144._24_4_;
          auVar147._0_4_ = auVar160._0_4_ + auVar24._0_4_ * fVar249;
          auVar147._4_4_ = auVar160._4_4_ + auVar24._4_4_ * fVar227;
          auVar147._8_4_ = auVar160._8_4_ + auVar24._8_4_ * fVar250;
          auVar147._12_4_ = auVar160._12_4_ + auVar24._12_4_ * fVar229;
          auVar147._16_4_ = auVar160._0_4_ + auVar24._16_4_ * fVar251;
          auVar147._20_4_ = auVar160._4_4_ + auVar24._20_4_ * fVar180;
          auVar147._24_4_ = auVar160._8_4_ + auVar24._24_4_ * fVar196;
          auVar147._28_4_ = auVar160._12_4_ + auVar24._28_4_;
          auVar144 = vsubps_avx(auVar224,auVar178);
          auVar179._0_4_ = auVar214._0_4_ + auVar144._0_4_ * fVar249;
          auVar179._4_4_ = auVar214._4_4_ + auVar144._4_4_ * fVar227;
          auVar179._8_4_ = auVar214._8_4_ + auVar144._8_4_ * fVar250;
          auVar179._12_4_ = auVar214._12_4_ + auVar144._12_4_ * fVar229;
          auVar179._16_4_ = auVar214._0_4_ + auVar144._16_4_ * fVar251;
          auVar179._20_4_ = auVar214._4_4_ + auVar144._20_4_ * fVar180;
          auVar179._24_4_ = auVar214._8_4_ + auVar144._24_4_ * fVar196;
          auVar179._28_4_ = auVar214._12_4_ + auVar144._28_4_;
          auVar96 = vsubps_avx(auVar93,auVar241);
          auVar111._0_4_ = auVar241._0_4_ + auVar96._0_4_ * fVar249;
          auVar111._4_4_ = auVar241._4_4_ + auVar96._4_4_ * fVar227;
          auVar111._8_4_ = auVar241._8_4_ + auVar96._8_4_ * fVar250;
          auVar111._12_4_ = auVar241._12_4_ + auVar96._12_4_ * fVar229;
          auVar111._16_4_ = auVar241._0_4_ + auVar96._0_4_ * fVar251;
          auVar111._20_4_ = auVar241._4_4_ + auVar96._4_4_ * fVar180;
          auVar111._24_4_ = auVar241._8_4_ + auVar96._8_4_ * fVar196;
          auVar111._28_4_ = auVar241._12_4_ + auVar96._12_4_;
          auVar144 = vsubps_avx(auVar179,auVar147);
          auVar148._0_4_ = auVar147._0_4_ + fVar249 * auVar144._0_4_;
          auVar148._4_4_ = auVar147._4_4_ + fVar227 * auVar144._4_4_;
          auVar148._8_4_ = auVar147._8_4_ + fVar250 * auVar144._8_4_;
          auVar148._12_4_ = auVar147._12_4_ + fVar229 * auVar144._12_4_;
          auVar148._16_4_ = auVar147._16_4_ + fVar251 * auVar144._16_4_;
          auVar148._20_4_ = auVar147._20_4_ + fVar180 * auVar144._20_4_;
          auVar148._24_4_ = auVar147._24_4_ + fVar196 * auVar144._24_4_;
          auVar148._28_4_ = auVar147._28_4_ + auVar144._28_4_;
          auVar144 = vsubps_avx(auVar111,auVar179);
          auVar112._0_4_ = auVar179._0_4_ + fVar249 * auVar144._0_4_;
          auVar112._4_4_ = auVar179._4_4_ + fVar227 * auVar144._4_4_;
          auVar112._8_4_ = auVar179._8_4_ + fVar250 * auVar144._8_4_;
          auVar112._12_4_ = auVar179._12_4_ + fVar229 * auVar144._12_4_;
          auVar112._16_4_ = auVar179._16_4_ + fVar251 * auVar144._16_4_;
          auVar112._20_4_ = auVar179._20_4_ + fVar180 * auVar144._20_4_;
          auVar112._24_4_ = auVar179._24_4_ + fVar196 * auVar144._24_4_;
          auVar112._28_4_ = auVar179._28_4_ + auVar144._28_4_;
          auVar144 = vsubps_avx(auVar112,auVar148);
          auVar258._0_4_ = auVar148._0_4_ + fVar249 * auVar144._0_4_;
          auVar258._4_4_ = auVar148._4_4_ + fVar227 * auVar144._4_4_;
          auVar258._8_4_ = auVar148._8_4_ + fVar250 * auVar144._8_4_;
          auVar258._12_4_ = auVar148._12_4_ + fVar229 * auVar144._12_4_;
          auVar261._16_4_ = auVar148._16_4_ + fVar251 * auVar144._16_4_;
          auVar261._0_16_ = auVar258;
          auVar261._20_4_ = auVar148._20_4_ + fVar180 * auVar144._20_4_;
          auVar261._24_4_ = auVar148._24_4_ + fVar196 * auVar144._24_4_;
          auVar261._28_4_ = auVar148._28_4_ + auVar179._28_4_;
          auVar263 = auVar261._16_16_;
          auVar127 = vshufps_avx(ZEXT416((uint)(fVar231 * 0.33333334)),
                                 ZEXT416((uint)(fVar231 * 0.33333334)),0);
          auVar215._0_4_ = auVar258._0_4_ + auVar127._0_4_ * auVar144._0_4_ * 3.0;
          auVar215._4_4_ = auVar258._4_4_ + auVar127._4_4_ * auVar144._4_4_ * 3.0;
          auVar215._8_4_ = auVar258._8_4_ + auVar127._8_4_ * auVar144._8_4_ * 3.0;
          auVar215._12_4_ = auVar258._12_4_ + auVar127._12_4_ * auVar144._12_4_ * 3.0;
          auVar176 = vshufpd_avx(auVar258,auVar258,3);
          auVar139 = vshufpd_avx(auVar263,auVar263,3);
          _local_308 = auVar176;
          auVar96 = vsubps_avx(auVar176,auVar258);
          _local_498 = auVar139;
          auVar189 = vsubps_avx(auVar139,auVar263);
          auVar94._0_4_ = auVar96._0_4_ + auVar189._0_4_;
          auVar94._4_4_ = auVar96._4_4_ + auVar189._4_4_;
          auVar94._8_4_ = auVar96._8_4_ + auVar189._8_4_;
          auVar94._12_4_ = auVar96._12_4_ + auVar189._12_4_;
          auVar96 = vmovshdup_avx(auVar258);
          auVar189 = vmovshdup_avx(auVar215);
          auVar162 = vshufps_avx(auVar94,auVar94,0);
          auVar128 = vshufps_avx(auVar94,auVar94,0x55);
          fVar249 = auVar128._0_4_;
          fVar227 = auVar128._4_4_;
          fVar250 = auVar128._8_4_;
          fVar229 = auVar128._12_4_;
          fVar251 = auVar162._0_4_;
          fVar180 = auVar162._4_4_;
          fVar196 = auVar162._8_4_;
          fVar197 = auVar162._12_4_;
          auVar95._0_4_ = fVar251 * auVar258._0_4_ + auVar96._0_4_ * fVar249;
          auVar95._4_4_ = fVar180 * auVar258._4_4_ + auVar96._4_4_ * fVar227;
          auVar95._8_4_ = fVar196 * auVar258._8_4_ + auVar96._8_4_ * fVar250;
          auVar95._12_4_ = fVar197 * auVar258._12_4_ + auVar96._12_4_ * fVar229;
          _local_3f8 = auVar215;
          auVar317._0_4_ = fVar251 * auVar215._0_4_ + auVar189._0_4_ * fVar249;
          auVar317._4_4_ = fVar180 * auVar215._4_4_ + auVar189._4_4_ * fVar227;
          auVar317._8_4_ = fVar196 * auVar215._8_4_ + auVar189._8_4_ * fVar250;
          auVar317._12_4_ = fVar197 * auVar215._12_4_ + auVar189._12_4_ * fVar229;
          auVar189 = vshufps_avx(auVar95,auVar95,0xe8);
          auVar162 = vshufps_avx(auVar317,auVar317,0xe8);
          auVar96 = vcmpps_avx(auVar189,auVar162,1);
          uVar67 = vextractps_avx(auVar96,0);
          auVar128 = auVar317;
          if ((uVar67 & 1) == 0) {
            auVar128 = auVar95;
          }
          auVar126._0_4_ = auVar127._0_4_ * auVar144._16_4_ * 3.0;
          auVar126._4_4_ = auVar127._4_4_ * auVar144._20_4_ * 3.0;
          auVar126._8_4_ = auVar127._8_4_ * auVar144._24_4_ * 3.0;
          auVar126._12_4_ = auVar127._12_4_ * 0.0;
          auVar19 = vsubps_avx(auVar263,auVar126);
          auVar127 = vmovshdup_avx(auVar19);
          auVar263 = vmovshdup_avx(auVar263);
          fVar198 = auVar19._0_4_;
          fVar199 = auVar19._4_4_;
          auVar242._0_4_ = fVar198 * fVar251 + auVar127._0_4_ * fVar249;
          auVar242._4_4_ = fVar199 * fVar180 + auVar127._4_4_ * fVar227;
          auVar242._8_4_ = auVar19._8_4_ * fVar196 + auVar127._8_4_ * fVar250;
          auVar242._12_4_ = auVar19._12_4_ * fVar197 + auVar127._12_4_ * fVar229;
          auVar358._0_4_ = fVar251 * auVar261._16_4_ + auVar263._0_4_ * fVar249;
          auVar358._4_4_ = fVar180 * auVar261._20_4_ + auVar263._4_4_ * fVar227;
          auVar358._8_4_ = fVar196 * auVar261._24_4_ + auVar263._8_4_ * fVar250;
          auVar358._12_4_ = fVar197 * auVar261._28_4_ + auVar263._12_4_ * fVar229;
          auVar263 = vshufps_avx(auVar242,auVar242,0xe8);
          auVar20 = vshufps_avx(auVar358,auVar358,0xe8);
          auVar127 = vcmpps_avx(auVar263,auVar20,1);
          uVar67 = vextractps_avx(auVar127,0);
          auVar331 = auVar358;
          if ((uVar67 & 1) == 0) {
            auVar331 = auVar242;
          }
          auVar128 = vmaxss_avx(auVar331,auVar128);
          auVar189 = vminps_avx(auVar189,auVar162);
          auVar162 = vminps_avx(auVar263,auVar20);
          auVar162 = vminps_avx(auVar189,auVar162);
          auVar96 = vshufps_avx(auVar96,auVar96,0x55);
          auVar96 = vblendps_avx(auVar96,auVar127,2);
          auVar127 = vpslld_avx(auVar96,0x1f);
          auVar96 = vshufpd_avx(auVar317,auVar317,1);
          auVar96 = vinsertps_avx(auVar96,auVar358,0x9c);
          auVar189 = vshufpd_avx(auVar95,auVar95,1);
          auVar189 = vinsertps_avx(auVar189,auVar242,0x9c);
          auVar96 = vblendvps_avx(auVar189,auVar96,auVar127);
          auVar189 = vmovshdup_avx(auVar96);
          auVar96 = vmaxss_avx(auVar189,auVar96);
          fVar250 = auVar162._0_4_;
          auVar189 = vmovshdup_avx(auVar162);
          fVar227 = auVar96._0_4_;
          fVar229 = auVar189._0_4_;
          fVar249 = auVar128._0_4_;
          if ((fVar250 < 0.0001) && (-0.0001 < fVar227)) break;
          if ((fVar229 < 0.0001 && -0.0001 < fVar249) || (fVar250 < 0.0001 && -0.0001 < fVar249))
          break;
          auVar127 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar96,1);
          auVar189 = vcmpps_avx(auVar189,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar189 = vandps_avx(auVar189,auVar127);
        } while ((auVar189 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar127 = vcmpps_avx(auVar162,_DAT_01f45a50,1);
        auVar189 = vcmpss_avx(auVar128,ZEXT416(0) << 0x20,1);
        auVar161._8_4_ = 0x3f800000;
        auVar161._0_8_ = 0x3f8000003f800000;
        auVar161._12_4_ = 0x3f800000;
        auVar216._8_4_ = 0xbf800000;
        auVar216._0_8_ = 0xbf800000bf800000;
        auVar216._12_4_ = 0xbf800000;
        auVar189 = vblendvps_avx(auVar161,auVar216,auVar189);
        auVar127 = vblendvps_avx(auVar161,auVar216,auVar127);
        auVar162 = vcmpss_avx(auVar127,auVar189,4);
        auVar162 = vpshufd_avx(ZEXT416(auVar162._0_4_ & 1),0x50);
        auVar162 = vpslld_avx(auVar162,0x1f);
        auVar162 = vpsrad_avx(auVar162,0x1f);
        auVar162 = vpandn_avx(auVar162,_DAT_01f7afb0);
        auVar128 = vmovshdup_avx(auVar127);
        fVar251 = auVar128._0_4_;
        if ((auVar127._0_4_ != fVar251) || (NAN(auVar127._0_4_) || NAN(fVar251))) {
          if ((fVar229 != fVar250) || (NAN(fVar229) || NAN(fVar250))) {
            fVar250 = -fVar250 / (fVar229 - fVar250);
            auVar127 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar250) * 0.0 + fVar250)));
          }
          else {
            auVar127 = ZEXT816(0x3f80000000000000);
            if ((fVar250 != 0.0) || (NAN(fVar250))) {
              auVar127 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar263 = vcmpps_avx(auVar162,auVar127,1);
          auVar128 = vblendps_avx(auVar162,auVar127,2);
          auVar127 = vblendps_avx(auVar127,auVar162,2);
          auVar162 = vblendvps_avx(auVar127,auVar128,auVar263);
        }
        auVar96 = vcmpss_avx(auVar96,ZEXT416(0) << 0x20,1);
        auVar163._8_4_ = 0x3f800000;
        auVar163._0_8_ = 0x3f8000003f800000;
        auVar163._12_4_ = 0x3f800000;
        auVar217._8_4_ = 0xbf800000;
        auVar217._0_8_ = 0xbf800000bf800000;
        auVar217._12_4_ = 0xbf800000;
        auVar96 = vblendvps_avx(auVar163,auVar217,auVar96);
        fVar250 = auVar96._0_4_;
        if ((auVar189._0_4_ != fVar250) || (NAN(auVar189._0_4_) || NAN(fVar250))) {
          if ((fVar227 != fVar249) || (NAN(fVar227) || NAN(fVar249))) {
            fVar249 = -fVar249 / (fVar227 - fVar249);
            auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar249) * 0.0 + fVar249)));
          }
          else {
            auVar96 = ZEXT816(0x3f80000000000000);
            if ((fVar249 != 0.0) || (NAN(fVar249))) {
              auVar96 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar127 = vcmpps_avx(auVar162,auVar96,1);
          auVar189 = vblendps_avx(auVar162,auVar96,2);
          auVar96 = vblendps_avx(auVar96,auVar162,2);
          auVar162 = vblendvps_avx(auVar96,auVar189,auVar127);
        }
        if ((fVar251 != fVar250) || (NAN(fVar251) || NAN(fVar250))) {
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = 0x3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar96 = vcmpps_avx(auVar162,auVar97,1);
          auVar189 = vinsertps_avx(auVar162,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar164._4_12_ = auVar162._4_12_;
          auVar164._0_4_ = 0x3f800000;
          auVar162 = vblendvps_avx(auVar164,auVar189,auVar96);
        }
        auVar96 = vcmpps_avx(auVar162,_DAT_01f46740,1);
        auVar60._12_4_ = 0;
        auVar60._0_12_ = auVar162._4_12_;
        auVar189 = vinsertps_avx(auVar162,ZEXT416(0x3f800000),0x10);
        auVar96 = vblendvps_avx(auVar189,auVar60 << 0x20,auVar96);
        auVar189 = vmovshdup_avx(auVar96);
      } while (auVar189._0_4_ < auVar96._0_4_);
      auVar98._0_4_ = auVar96._0_4_ + -0.1;
      auVar98._4_4_ = auVar96._4_4_ + 0.1;
      auVar98._8_4_ = auVar96._8_4_ + 0.0;
      auVar98._12_4_ = auVar96._12_4_ + 0.0;
      auVar127 = vshufpd_avx(auVar215,auVar215,3);
      register0x00001388 = 0x3f80000000000000;
      local_3f8 = 0x3f80000000000000;
      auVar96 = vcmpps_avx(auVar98,_local_3f8,1);
      auVar58._12_4_ = 0;
      auVar58._0_12_ = auVar98._4_12_;
      auVar189 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar96 = vblendvps_avx(auVar189,auVar58 << 0x20,auVar96);
      auVar189 = vshufpd_avx(auVar19,auVar19,3);
      auVar162 = vshufps_avx(auVar96,auVar96,0x50);
      auVar259._8_4_ = 0x3f800000;
      auVar259._0_8_ = 0x3f8000003f800000;
      auVar259._12_4_ = 0x3f800000;
      auVar128 = vsubps_avx(auVar259,auVar162);
      local_308._0_4_ = auVar176._0_4_;
      local_308._4_4_ = auVar176._4_4_;
      fStack_300 = auVar176._8_4_;
      fStack_2fc = auVar176._12_4_;
      fVar249 = auVar162._0_4_;
      fVar227 = auVar162._4_4_;
      fVar250 = auVar162._8_4_;
      fVar229 = auVar162._12_4_;
      local_498._0_4_ = auVar139._0_4_;
      local_498._4_4_ = auVar139._4_4_;
      fStack_490 = auVar139._8_4_;
      fStack_48c = auVar139._12_4_;
      fVar251 = auVar128._0_4_;
      fVar180 = auVar128._4_4_;
      fVar196 = auVar128._8_4_;
      fVar197 = auVar128._12_4_;
      auVar99._0_4_ = fVar249 * (float)local_308._0_4_ + fVar251 * auVar258._0_4_;
      auVar99._4_4_ = fVar227 * (float)local_308._4_4_ + fVar180 * auVar258._4_4_;
      auVar99._8_4_ = fVar250 * fStack_300 + fVar196 * auVar258._0_4_;
      auVar99._12_4_ = fVar229 * fStack_2fc + fVar197 * auVar258._4_4_;
      auVar243._0_4_ = auVar127._0_4_ * fVar249 + fVar251 * auVar215._0_4_;
      auVar243._4_4_ = auVar127._4_4_ * fVar227 + fVar180 * auVar215._4_4_;
      auVar243._8_4_ = auVar127._8_4_ * fVar250 + fVar196 * auVar215._0_4_;
      auVar243._12_4_ = auVar127._12_4_ * fVar229 + fVar197 * auVar215._4_4_;
      auVar271._0_4_ = auVar189._0_4_ * fVar249 + fVar251 * fVar198;
      auVar271._4_4_ = auVar189._4_4_ * fVar227 + fVar180 * fVar199;
      auVar271._8_4_ = auVar189._8_4_ * fVar250 + fVar196 * fVar198;
      auVar271._12_4_ = auVar189._12_4_ * fVar229 + fVar197 * fVar199;
      auVar308._0_4_ = fVar249 * (float)local_498._0_4_ + fVar251 * auVar261._16_4_;
      auVar308._4_4_ = fVar227 * (float)local_498._4_4_ + fVar180 * auVar261._20_4_;
      auVar308._8_4_ = fVar250 * fStack_490 + fVar196 * auVar261._16_4_;
      auVar308._12_4_ = fVar229 * fStack_48c + fVar197 * auVar261._20_4_;
      auVar139 = vsubps_avx(auVar259,auVar96);
      auVar189 = vmovshdup_avx(auVar332);
      auVar176 = vmovsldup_avx(auVar332);
      auVar260._0_4_ = auVar139._0_4_ * auVar176._0_4_ + auVar96._0_4_ * auVar189._0_4_;
      auVar260._4_4_ = auVar139._4_4_ * auVar176._4_4_ + auVar96._4_4_ * auVar189._4_4_;
      auVar260._8_4_ = auVar139._8_4_ * auVar176._8_4_ + auVar96._8_4_ * auVar189._8_4_;
      auVar260._12_4_ = auVar139._12_4_ * auVar176._12_4_ + auVar96._12_4_ * auVar189._12_4_;
      _local_498 = vmovshdup_avx(auVar260);
      auVar96 = vsubps_avx(auVar243,auVar99);
      auVar165._0_4_ = auVar96._0_4_ * 3.0;
      auVar165._4_4_ = auVar96._4_4_ * 3.0;
      auVar165._8_4_ = auVar96._8_4_ * 3.0;
      auVar165._12_4_ = auVar96._12_4_ * 3.0;
      auVar96 = vsubps_avx(auVar271,auVar243);
      auVar192._0_4_ = auVar96._0_4_ * 3.0;
      auVar192._4_4_ = auVar96._4_4_ * 3.0;
      auVar192._8_4_ = auVar96._8_4_ * 3.0;
      auVar192._12_4_ = auVar96._12_4_ * 3.0;
      auVar96 = vsubps_avx(auVar308,auVar271);
      auVar287._0_4_ = auVar96._0_4_ * 3.0;
      auVar287._4_4_ = auVar96._4_4_ * 3.0;
      auVar287._8_4_ = auVar96._8_4_ * 3.0;
      auVar287._12_4_ = auVar96._12_4_ * 3.0;
      auVar189 = vminps_avx(auVar192,auVar287);
      auVar96 = vmaxps_avx(auVar192,auVar287);
      auVar189 = vminps_avx(auVar165,auVar189);
      auVar96 = vmaxps_avx(auVar165,auVar96);
      auVar176 = vshufpd_avx(auVar189,auVar189,3);
      auVar139 = vshufpd_avx(auVar96,auVar96,3);
      auVar189 = vminps_avx(auVar189,auVar176);
      auVar96 = vmaxps_avx(auVar96,auVar139);
      auVar176 = vshufps_avx(ZEXT416((uint)(1.0 / fVar231)),ZEXT416((uint)(1.0 / fVar231)),0);
      auVar288._0_4_ = auVar176._0_4_ * auVar189._0_4_;
      auVar288._4_4_ = auVar176._4_4_ * auVar189._4_4_;
      auVar288._8_4_ = auVar176._8_4_ * auVar189._8_4_;
      auVar288._12_4_ = auVar176._12_4_ * auVar189._12_4_;
      auVar297._0_4_ = auVar176._0_4_ * auVar96._0_4_;
      auVar297._4_4_ = auVar176._4_4_ * auVar96._4_4_;
      auVar297._8_4_ = auVar176._8_4_ * auVar96._8_4_;
      auVar297._12_4_ = auVar176._12_4_ * auVar96._12_4_;
      auVar128 = ZEXT416((uint)(1.0 / (local_498._0_4_ - auVar260._0_4_)));
      auVar96 = vshufpd_avx(auVar99,auVar99,3);
      auVar189 = vshufpd_avx(auVar243,auVar243,3);
      auVar176 = vshufpd_avx(auVar271,auVar271,3);
      auVar139 = vshufpd_avx(auVar308,auVar308,3);
      auVar96 = vsubps_avx(auVar96,auVar99);
      auVar127 = vsubps_avx(auVar189,auVar243);
      auVar162 = vsubps_avx(auVar176,auVar271);
      auVar139 = vsubps_avx(auVar139,auVar308);
      auVar189 = vminps_avx(auVar96,auVar127);
      auVar96 = vmaxps_avx(auVar96,auVar127);
      auVar176 = vminps_avx(auVar162,auVar139);
      auVar176 = vminps_avx(auVar189,auVar176);
      auVar189 = vmaxps_avx(auVar162,auVar139);
      auVar96 = vmaxps_avx(auVar96,auVar189);
      auVar189 = vshufps_avx(auVar128,auVar128,0);
      auVar342._0_4_ = auVar189._0_4_ * auVar176._0_4_;
      auVar342._4_4_ = auVar189._4_4_ * auVar176._4_4_;
      auVar342._8_4_ = auVar189._8_4_ * auVar176._8_4_;
      auVar342._12_4_ = auVar189._12_4_ * auVar176._12_4_;
      auVar352._0_4_ = auVar189._0_4_ * auVar96._0_4_;
      auVar352._4_4_ = auVar189._4_4_ * auVar96._4_4_;
      auVar352._8_4_ = auVar189._8_4_ * auVar96._8_4_;
      auVar352._12_4_ = auVar189._12_4_ * auVar96._12_4_;
      auVar96 = vmovsldup_avx(auVar260);
      auVar309._4_12_ = auVar96._4_12_;
      auVar309._0_4_ = fVar225;
      auVar318._4_12_ = auVar260._4_12_;
      auVar318._0_4_ = fVar200;
      auVar193._0_4_ = (fVar225 + fVar200) * 0.5;
      auVar193._4_4_ = (auVar96._4_4_ + auVar260._4_4_) * 0.5;
      auVar193._8_4_ = (auVar96._8_4_ + auVar260._8_4_) * 0.5;
      auVar193._12_4_ = (auVar96._12_4_ + auVar260._12_4_) * 0.5;
      auVar96 = vshufps_avx(auVar193,auVar193,0);
      fVar249 = auVar96._0_4_;
      fVar227 = auVar96._4_4_;
      fVar250 = auVar96._8_4_;
      fVar229 = auVar96._12_4_;
      auVar129._0_4_ = fVar249 * (float)local_1c8._0_4_ + (float)local_448._0_4_;
      auVar129._4_4_ = fVar227 * (float)local_1c8._4_4_ + (float)local_448._4_4_;
      auVar129._8_4_ = fVar250 * fStack_1c0 + fStack_440;
      auVar129._12_4_ = fVar229 * fStack_1bc + fStack_43c;
      auVar166._0_4_ = fVar249 * (float)local_1d8._0_4_ + (float)local_458._0_4_;
      auVar166._4_4_ = fVar227 * (float)local_1d8._4_4_ + (float)local_458._4_4_;
      auVar166._8_4_ = fVar250 * fStack_1d0 + fStack_450;
      auVar166._12_4_ = fVar229 * fStack_1cc + fStack_44c;
      auVar244._0_4_ = fVar249 * (float)local_1e8._0_4_ + (float)local_468._0_4_;
      auVar244._4_4_ = fVar227 * (float)local_1e8._4_4_ + (float)local_468._4_4_;
      auVar244._8_4_ = fVar250 * fStack_1e0 + fStack_460;
      auVar244._12_4_ = fVar229 * fStack_1dc + fStack_45c;
      auVar96 = vsubps_avx(auVar166,auVar129);
      auVar130._0_4_ = auVar129._0_4_ + fVar249 * auVar96._0_4_;
      auVar130._4_4_ = auVar129._4_4_ + fVar227 * auVar96._4_4_;
      auVar130._8_4_ = auVar129._8_4_ + fVar250 * auVar96._8_4_;
      auVar130._12_4_ = auVar129._12_4_ + fVar229 * auVar96._12_4_;
      auVar96 = vsubps_avx(auVar244,auVar166);
      auVar167._0_4_ = auVar166._0_4_ + fVar249 * auVar96._0_4_;
      auVar167._4_4_ = auVar166._4_4_ + fVar227 * auVar96._4_4_;
      auVar167._8_4_ = auVar166._8_4_ + fVar250 * auVar96._8_4_;
      auVar167._12_4_ = auVar166._12_4_ + fVar229 * auVar96._12_4_;
      auVar96 = vsubps_avx(auVar167,auVar130);
      fVar249 = auVar130._0_4_ + fVar249 * auVar96._0_4_;
      fVar227 = auVar130._4_4_ + fVar227 * auVar96._4_4_;
      auVar100._0_8_ = CONCAT44(fVar227,fVar249);
      auVar100._8_4_ = auVar130._8_4_ + fVar250 * auVar96._8_4_;
      auVar100._12_4_ = auVar130._12_4_ + fVar229 * auVar96._12_4_;
      fVar250 = auVar96._0_4_ * 3.0;
      fVar229 = auVar96._4_4_ * 3.0;
      auVar131._0_8_ = CONCAT44(fVar229,fVar250);
      auVar131._8_4_ = auVar96._8_4_ * 3.0;
      auVar131._12_4_ = auVar96._12_4_ * 3.0;
      auVar168._8_8_ = auVar100._0_8_;
      auVar168._0_8_ = auVar100._0_8_;
      auVar96 = vshufpd_avx(auVar100,auVar100,3);
      auVar189 = vshufps_avx(auVar193,auVar193,0x55);
      auVar162 = vsubps_avx(auVar96,auVar168);
      auVar333._0_4_ = auVar162._0_4_ * auVar189._0_4_ + fVar249;
      auVar333._4_4_ = auVar162._4_4_ * auVar189._4_4_ + fVar227;
      auVar333._8_4_ = auVar162._8_4_ * auVar189._8_4_ + fVar249;
      auVar333._12_4_ = auVar162._12_4_ * auVar189._12_4_ + fVar227;
      auVar169._8_8_ = auVar131._0_8_;
      auVar169._0_8_ = auVar131._0_8_;
      auVar96 = vshufpd_avx(auVar131,auVar131,1);
      auVar96 = vsubps_avx(auVar96,auVar169);
      auVar132._0_4_ = auVar96._0_4_ * auVar189._0_4_ + fVar250;
      auVar132._4_4_ = auVar96._4_4_ * auVar189._4_4_ + fVar229;
      auVar132._8_4_ = auVar96._8_4_ * auVar189._8_4_ + fVar250;
      auVar132._12_4_ = auVar96._12_4_ * auVar189._12_4_ + fVar229;
      auVar189 = vmovshdup_avx(auVar132);
      auVar245._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
      auVar245._8_4_ = auVar189._8_4_ ^ 0x80000000;
      auVar245._12_4_ = auVar189._12_4_ ^ 0x80000000;
      auVar176 = vmovshdup_avx(auVar162);
      auVar96 = vunpcklps_avx(auVar176,auVar245);
      auVar139 = vshufps_avx(auVar96,auVar245,4);
      auVar101._0_8_ = auVar162._0_8_ ^ 0x8000000080000000;
      auVar101._8_4_ = -auVar162._8_4_;
      auVar101._12_4_ = -auVar162._12_4_;
      auVar96 = vmovlhps_avx(auVar101,auVar132);
      auVar127 = vshufps_avx(auVar96,auVar132,8);
      auVar96 = ZEXT416((uint)(auVar132._0_4_ * auVar176._0_4_ - auVar162._0_4_ * auVar189._0_4_));
      auVar189 = vshufps_avx(auVar96,auVar96,0);
      auVar96 = vdivps_avx(auVar139,auVar189);
      auVar189 = vdivps_avx(auVar127,auVar189);
      auVar127 = vinsertps_avx(auVar288,auVar342,0x1c);
      auVar162 = vinsertps_avx(auVar297,auVar352,0x1c);
      auVar128 = vinsertps_avx(auVar342,auVar288,0x4c);
      auVar263 = vinsertps_avx(auVar352,auVar297,0x4c);
      auVar176 = vmovsldup_avx(auVar96);
      auVar170._0_4_ = auVar176._0_4_ * auVar127._0_4_;
      auVar170._4_4_ = auVar176._4_4_ * auVar127._4_4_;
      auVar170._8_4_ = auVar176._8_4_ * auVar127._8_4_;
      auVar170._12_4_ = auVar176._12_4_ * auVar127._12_4_;
      auVar133._0_4_ = auVar162._0_4_ * auVar176._0_4_;
      auVar133._4_4_ = auVar162._4_4_ * auVar176._4_4_;
      auVar133._8_4_ = auVar162._8_4_ * auVar176._8_4_;
      auVar133._12_4_ = auVar162._12_4_ * auVar176._12_4_;
      auVar139 = vminps_avx(auVar170,auVar133);
      auVar176 = vmaxps_avx(auVar133,auVar170);
      auVar20 = vmovsldup_avx(auVar189);
      auVar353._0_4_ = auVar128._0_4_ * auVar20._0_4_;
      auVar353._4_4_ = auVar128._4_4_ * auVar20._4_4_;
      auVar353._8_4_ = auVar128._8_4_ * auVar20._8_4_;
      auVar353._12_4_ = auVar128._12_4_ * auVar20._12_4_;
      auVar171._0_4_ = auVar263._0_4_ * auVar20._0_4_;
      auVar171._4_4_ = auVar263._4_4_ * auVar20._4_4_;
      auVar171._8_4_ = auVar263._8_4_ * auVar20._8_4_;
      auVar171._12_4_ = auVar263._12_4_ * auVar20._12_4_;
      auVar20 = vminps_avx(auVar353,auVar171);
      auVar218._0_4_ = auVar139._0_4_ + auVar20._0_4_;
      auVar218._4_4_ = auVar139._4_4_ + auVar20._4_4_;
      auVar218._8_4_ = auVar139._8_4_ + auVar20._8_4_;
      auVar218._12_4_ = auVar139._12_4_ + auVar20._12_4_;
      auVar139 = vmaxps_avx(auVar171,auVar353);
      auVar20 = vsubps_avx(auVar309,auVar193);
      auVar19 = vsubps_avx(auVar318,auVar193);
      auVar134._0_4_ = auVar176._0_4_ + auVar139._0_4_;
      auVar134._4_4_ = auVar176._4_4_ + auVar139._4_4_;
      auVar134._8_4_ = auVar176._8_4_ + auVar139._8_4_;
      auVar134._12_4_ = auVar176._12_4_ + auVar139._12_4_;
      auVar172._8_8_ = 0x3f800000;
      auVar172._0_8_ = 0x3f800000;
      auVar176 = vsubps_avx(auVar172,auVar134);
      auVar139 = vsubps_avx(auVar172,auVar218);
      fVar196 = auVar20._0_4_;
      auVar219._0_4_ = fVar196 * auVar176._0_4_;
      fVar197 = auVar20._4_4_;
      auVar219._4_4_ = fVar197 * auVar176._4_4_;
      fVar198 = auVar20._8_4_;
      auVar219._8_4_ = fVar198 * auVar176._8_4_;
      fVar199 = auVar20._12_4_;
      auVar219._12_4_ = fVar199 * auVar176._12_4_;
      fVar250 = auVar19._0_4_;
      auVar135._0_4_ = fVar250 * auVar176._0_4_;
      fVar229 = auVar19._4_4_;
      auVar135._4_4_ = fVar229 * auVar176._4_4_;
      fVar251 = auVar19._8_4_;
      auVar135._8_4_ = fVar251 * auVar176._8_4_;
      fVar180 = auVar19._12_4_;
      auVar135._12_4_ = fVar180 * auVar176._12_4_;
      auVar310._0_4_ = fVar196 * auVar139._0_4_;
      auVar310._4_4_ = fVar197 * auVar139._4_4_;
      auVar310._8_4_ = fVar198 * auVar139._8_4_;
      auVar310._12_4_ = fVar199 * auVar139._12_4_;
      auVar173._0_4_ = fVar250 * auVar139._0_4_;
      auVar173._4_4_ = fVar229 * auVar139._4_4_;
      auVar173._8_4_ = fVar251 * auVar139._8_4_;
      auVar173._12_4_ = fVar180 * auVar139._12_4_;
      auVar176 = vminps_avx(auVar219,auVar310);
      auVar139 = vminps_avx(auVar135,auVar173);
      auVar20 = vminps_avx(auVar176,auVar139);
      auVar176 = vmaxps_avx(auVar310,auVar219);
      auVar139 = vmaxps_avx(auVar173,auVar135);
      auVar19 = vshufps_avx(auVar193,auVar193,0x54);
      auVar139 = vmaxps_avx(auVar139,auVar176);
      auVar331 = vshufps_avx(auVar333,auVar333,0);
      auVar21 = vshufps_avx(auVar333,auVar333,0x55);
      auVar176 = vhaddps_avx(auVar20,auVar20);
      auVar139 = vhaddps_avx(auVar139,auVar139);
      auVar194._0_4_ = auVar331._0_4_ * auVar96._0_4_ + auVar21._0_4_ * auVar189._0_4_;
      auVar194._4_4_ = auVar331._4_4_ * auVar96._4_4_ + auVar21._4_4_ * auVar189._4_4_;
      auVar194._8_4_ = auVar331._8_4_ * auVar96._8_4_ + auVar21._8_4_ * auVar189._8_4_;
      auVar194._12_4_ = auVar331._12_4_ * auVar96._12_4_ + auVar21._12_4_ * auVar189._12_4_;
      auVar20 = vsubps_avx(auVar19,auVar194);
      fVar249 = auVar20._0_4_ + auVar176._0_4_;
      fVar227 = auVar20._0_4_ + auVar139._0_4_;
      auVar176 = vmaxss_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar249));
      auVar139 = vminss_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar200));
    } while (auVar139._0_4_ < auVar176._0_4_);
    auVar176 = vmovshdup_avx(auVar96);
    auVar102._0_4_ = auVar176._0_4_ * auVar127._0_4_;
    auVar102._4_4_ = auVar176._4_4_ * auVar127._4_4_;
    auVar102._8_4_ = auVar176._8_4_ * auVar127._8_4_;
    auVar102._12_4_ = auVar176._12_4_ * auVar127._12_4_;
    auVar136._0_4_ = auVar162._0_4_ * auVar176._0_4_;
    auVar136._4_4_ = auVar162._4_4_ * auVar176._4_4_;
    auVar136._8_4_ = auVar162._8_4_ * auVar176._8_4_;
    auVar136._12_4_ = auVar162._12_4_ * auVar176._12_4_;
    auVar139 = vminps_avx(auVar102,auVar136);
    auVar176 = vmaxps_avx(auVar136,auVar102);
    auVar127 = vmovshdup_avx(auVar189);
    auVar220._0_4_ = auVar128._0_4_ * auVar127._0_4_;
    auVar220._4_4_ = auVar128._4_4_ * auVar127._4_4_;
    auVar220._8_4_ = auVar128._8_4_ * auVar127._8_4_;
    auVar220._12_4_ = auVar128._12_4_ * auVar127._12_4_;
    auVar137._0_4_ = auVar263._0_4_ * auVar127._0_4_;
    auVar137._4_4_ = auVar263._4_4_ * auVar127._4_4_;
    auVar137._8_4_ = auVar263._8_4_ * auVar127._8_4_;
    auVar137._12_4_ = auVar263._12_4_ * auVar127._12_4_;
    auVar127 = vminps_avx(auVar220,auVar137);
    auVar174._0_4_ = auVar139._0_4_ + auVar127._0_4_;
    auVar174._4_4_ = auVar139._4_4_ + auVar127._4_4_;
    auVar174._8_4_ = auVar139._8_4_ + auVar127._8_4_;
    auVar174._12_4_ = auVar139._12_4_ + auVar127._12_4_;
    auVar139 = vmaxps_avx(auVar137,auVar220);
    auVar103._0_4_ = auVar176._0_4_ + auVar139._0_4_;
    auVar103._4_4_ = auVar176._4_4_ + auVar139._4_4_;
    auVar103._8_4_ = auVar176._8_4_ + auVar139._8_4_;
    auVar103._12_4_ = auVar176._12_4_ + auVar139._12_4_;
    auVar176 = vsubps_avx(_local_3f8,auVar103);
    auVar139 = vsubps_avx(_local_3f8,auVar174);
    auVar175._0_4_ = fVar196 * auVar176._0_4_;
    auVar175._4_4_ = fVar197 * auVar176._4_4_;
    auVar175._8_4_ = fVar198 * auVar176._8_4_;
    auVar175._12_4_ = fVar199 * auVar176._12_4_;
    auVar221._0_4_ = fVar196 * auVar139._0_4_;
    auVar221._4_4_ = fVar197 * auVar139._4_4_;
    auVar221._8_4_ = fVar198 * auVar139._8_4_;
    auVar221._12_4_ = fVar199 * auVar139._12_4_;
    auVar104._0_4_ = fVar250 * auVar176._0_4_;
    auVar104._4_4_ = fVar229 * auVar176._4_4_;
    auVar104._8_4_ = fVar251 * auVar176._8_4_;
    auVar104._12_4_ = fVar180 * auVar176._12_4_;
    auVar138._0_4_ = fVar250 * auVar139._0_4_;
    auVar138._4_4_ = fVar229 * auVar139._4_4_;
    auVar138._8_4_ = fVar251 * auVar139._8_4_;
    auVar138._12_4_ = fVar180 * auVar139._12_4_;
    auVar176 = vminps_avx(auVar175,auVar221);
    auVar139 = vminps_avx(auVar104,auVar138);
    auVar176 = vminps_avx(auVar176,auVar139);
    auVar139 = vmaxps_avx(auVar221,auVar175);
    auVar127 = vmaxps_avx(auVar138,auVar104);
    auVar176 = vhaddps_avx(auVar176,auVar176);
    auVar139 = vmaxps_avx(auVar127,auVar139);
    auVar139 = vhaddps_avx(auVar139,auVar139);
    auVar127 = vmovshdup_avx(auVar20);
    auVar162 = ZEXT416((uint)(auVar127._0_4_ + auVar176._0_4_));
    auVar176 = vmaxss_avx(auVar260,auVar162);
    auVar127 = ZEXT416((uint)(auVar127._0_4_ + auVar139._0_4_));
    auVar139 = vminss_avx(auVar127,_local_498);
  } while (auVar139._0_4_ < auVar176._0_4_);
  bVar71 = 0;
  if ((fVar225 < fVar249) && (fVar227 < fVar200)) {
    auVar176 = vcmpps_avx(auVar127,_local_498,1);
    auVar139 = vcmpps_avx(auVar260,auVar162,1);
    auVar176 = vandps_avx(auVar139,auVar176);
    bVar71 = auVar176[0];
  }
  auVar289._8_4_ = 0x7fffffff;
  auVar289._0_8_ = 0x7fffffff7fffffff;
  auVar289._12_4_ = 0x7fffffff;
  if (((uint)uVar68 < 4 && 0.001 <= fVar231) && (bVar71 & 1) == 0) goto LAB_008b7617;
  lVar74 = 0xc9;
  do {
    lVar74 = lVar74 + -1;
    if (lVar74 == 0) goto LAB_008b6737;
    fVar231 = auVar20._0_4_;
    fVar200 = 1.0 - fVar231;
    auVar176 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
    auVar176 = vshufps_avx(auVar176,auVar176,0);
    auVar139 = ZEXT416((uint)(fVar231 * 3.0 * fVar200 * fVar200));
    auVar139 = vshufps_avx(auVar139,auVar139,0);
    auVar127 = ZEXT416((uint)(fVar200 * fVar231 * fVar231 * 3.0));
    auVar127 = vshufps_avx(auVar127,auVar127,0);
    auVar162 = ZEXT416((uint)(fVar231 * fVar231 * fVar231));
    auVar162 = vshufps_avx(auVar162,auVar162,0);
    fVar200 = (float)local_448._0_4_ * auVar176._0_4_ +
              (float)local_458._0_4_ * auVar139._0_4_ +
              (float)local_1f8._0_4_ * auVar162._0_4_ + (float)local_468._0_4_ * auVar127._0_4_;
    fVar231 = (float)local_448._4_4_ * auVar176._4_4_ +
              (float)local_458._4_4_ * auVar139._4_4_ +
              (float)local_1f8._4_4_ * auVar162._4_4_ + (float)local_468._4_4_ * auVar127._4_4_;
    auVar105._0_8_ = CONCAT44(fVar231,fVar200);
    auVar105._8_4_ =
         fStack_440 * auVar176._8_4_ +
         fStack_450 * auVar139._8_4_ + fStack_1f0 * auVar162._8_4_ + fStack_460 * auVar127._8_4_;
    auVar105._12_4_ =
         fStack_43c * auVar176._12_4_ +
         fStack_44c * auVar139._12_4_ + fStack_1ec * auVar162._12_4_ + fStack_45c * auVar127._12_4_;
    auVar140._8_8_ = auVar105._0_8_;
    auVar140._0_8_ = auVar105._0_8_;
    auVar139 = vshufpd_avx(auVar105,auVar105,1);
    auVar176 = vmovshdup_avx(auVar20);
    auVar139 = vsubps_avx(auVar139,auVar140);
    auVar106._0_4_ = auVar176._0_4_ * auVar139._0_4_ + fVar200;
    auVar106._4_4_ = auVar176._4_4_ * auVar139._4_4_ + fVar231;
    auVar106._8_4_ = auVar176._8_4_ * auVar139._8_4_ + fVar200;
    auVar106._12_4_ = auVar176._12_4_ * auVar139._12_4_ + fVar231;
    auVar176 = vshufps_avx(auVar106,auVar106,0);
    auVar139 = vshufps_avx(auVar106,auVar106,0x55);
    auVar141._0_4_ = auVar96._0_4_ * auVar176._0_4_ + auVar189._0_4_ * auVar139._0_4_;
    auVar141._4_4_ = auVar96._4_4_ * auVar176._4_4_ + auVar189._4_4_ * auVar139._4_4_;
    auVar141._8_4_ = auVar96._8_4_ * auVar176._8_4_ + auVar189._8_4_ * auVar139._8_4_;
    auVar141._12_4_ = auVar96._12_4_ * auVar176._12_4_ + auVar189._12_4_ * auVar139._12_4_;
    auVar20 = vsubps_avx(auVar20,auVar141);
    auVar176 = vandps_avx(auVar289,auVar106);
    auVar139 = vshufps_avx(auVar176,auVar176,0xf5);
    auVar176 = vmaxss_avx(auVar139,auVar176);
  } while ((float)local_208._0_4_ <= auVar176._0_4_);
  fVar200 = auVar20._0_4_;
  if ((fVar200 < 0.0) || (1.0 < fVar200)) goto LAB_008b6737;
  auVar96 = vmovshdup_avx(auVar20);
  fVar231 = auVar96._0_4_;
  if ((fVar231 < 0.0) || (1.0 < fVar231)) goto LAB_008b6737;
  auVar96 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar263 = vinsertps_avx(auVar96,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar11 = (ray->org).field_0;
  auVar96 = vsubps_avx(_local_378,(undefined1  [16])aVar11);
  auVar96 = vdpps_avx(auVar96,auVar263,0x7f);
  auVar189 = vsubps_avx(_local_388,(undefined1  [16])aVar11);
  auVar189 = vdpps_avx(auVar189,auVar263,0x7f);
  auVar176 = vsubps_avx(_local_398,(undefined1  [16])aVar11);
  auVar176 = vdpps_avx(auVar176,auVar263,0x7f);
  auVar139 = vsubps_avx(_local_3a8,(undefined1  [16])aVar11);
  auVar139 = vdpps_avx(auVar139,auVar263,0x7f);
  auVar127 = vsubps_avx(_local_3b8,(undefined1  [16])aVar11);
  auVar127 = vdpps_avx(auVar127,auVar263,0x7f);
  auVar162 = vsubps_avx(_local_3c8,(undefined1  [16])aVar11);
  auVar162 = vdpps_avx(auVar162,auVar263,0x7f);
  auVar66._4_4_ = fStack_3d4;
  auVar66._0_4_ = local_3d8;
  auVar66._8_4_ = fStack_3d0;
  auVar66._12_4_ = fStack_3cc;
  auVar128 = vsubps_avx(auVar66,(undefined1  [16])aVar11);
  auVar128 = vdpps_avx(auVar128,auVar263,0x7f);
  auVar64._4_4_ = fStack_404;
  auVar64._0_4_ = local_408;
  auVar64._8_4_ = fStack_400;
  auVar64._12_4_ = fStack_3fc;
  auVar19 = vsubps_avx(auVar64,(undefined1  [16])aVar11);
  auVar263 = vdpps_avx(auVar19,auVar263,0x7f);
  fVar229 = 1.0 - fVar231;
  fVar251 = 1.0 - fVar200;
  fVar225 = auVar20._4_4_;
  fVar249 = auVar20._8_4_;
  fVar227 = auVar20._12_4_;
  fVar250 = fVar251 * fVar200 * fVar200 * 3.0;
  auVar246._0_4_ = fVar200 * fVar200 * fVar200;
  auVar246._4_4_ = fVar225 * fVar225 * fVar225;
  auVar246._8_4_ = fVar249 * fVar249 * fVar249;
  auVar246._12_4_ = fVar227 * fVar227 * fVar227;
  fVar225 = fVar200 * 3.0 * fVar251 * fVar251;
  fVar249 = fVar251 * fVar251 * fVar251;
  fVar200 = (fVar229 * auVar96._0_4_ + auVar127._0_4_ * fVar231) * fVar249 +
            fVar225 * (auVar162._0_4_ * fVar231 + fVar229 * auVar189._0_4_) +
            fVar250 * (auVar128._0_4_ * fVar231 + fVar229 * auVar176._0_4_) +
            auVar246._0_4_ * (fVar229 * auVar139._0_4_ + fVar231 * auVar263._0_4_);
  if ((fVar200 < (ray->org).field_0.m128[3]) || (fVar231 = ray->tfar, fVar231 < fVar200))
  goto LAB_008b6737;
  pGVar13 = (context->scene->geometries).items[local_410].ptr;
  if ((pGVar13->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar71 = 1, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_008b75fe;
    auVar96 = vshufps_avx(auVar20,auVar20,0x55);
    auVar290._8_4_ = 0x3f800000;
    auVar290._0_8_ = 0x3f8000003f800000;
    auVar290._12_4_ = 0x3f800000;
    auVar189 = vsubps_avx(auVar290,auVar96);
    fVar227 = auVar96._0_4_;
    fVar229 = auVar96._4_4_;
    fVar180 = auVar96._8_4_;
    fVar196 = auVar96._12_4_;
    fVar197 = auVar189._0_4_;
    fVar198 = auVar189._4_4_;
    fVar199 = auVar189._8_4_;
    fVar201 = auVar189._12_4_;
    auVar298._0_4_ = fVar227 * (float)local_3b8._0_4_ + fVar197 * (float)local_378._0_4_;
    auVar298._4_4_ = fVar229 * (float)local_3b8._4_4_ + fVar198 * (float)local_378._4_4_;
    auVar298._8_4_ = fVar180 * fStack_3b0 + fVar199 * fStack_370;
    auVar298._12_4_ = fVar196 * fStack_3ac + fVar201 * fStack_36c;
    auVar311._0_4_ = fVar227 * (float)local_3c8._0_4_ + fVar197 * (float)local_388._0_4_;
    auVar311._4_4_ = fVar229 * (float)local_3c8._4_4_ + fVar198 * (float)local_388._4_4_;
    auVar311._8_4_ = fVar180 * fStack_3c0 + fVar199 * fStack_380;
    auVar311._12_4_ = fVar196 * fStack_3bc + fVar201 * fStack_37c;
    auVar319._0_4_ = fVar227 * local_3d8 + fVar197 * (float)local_398._0_4_;
    auVar319._4_4_ = fVar229 * fStack_3d4 + fVar198 * (float)local_398._4_4_;
    auVar319._8_4_ = fVar180 * fStack_3d0 + fVar199 * fStack_390;
    auVar319._12_4_ = fVar196 * fStack_3cc + fVar201 * fStack_38c;
    auVar272._0_4_ = fVar197 * (float)local_3a8._0_4_ + fVar227 * local_408;
    auVar272._4_4_ = fVar198 * (float)local_3a8._4_4_ + fVar229 * fStack_404;
    auVar272._8_4_ = fVar199 * fStack_3a0 + fVar180 * fStack_400;
    auVar272._12_4_ = fVar201 * fStack_39c + fVar196 * fStack_3fc;
    auVar139 = vsubps_avx(auVar311,auVar298);
    auVar127 = vsubps_avx(auVar319,auVar311);
    auVar162 = vsubps_avx(auVar272,auVar319);
    auVar96 = vshufps_avx(auVar20,auVar20,0);
    fVar196 = auVar96._0_4_;
    fVar197 = auVar96._4_4_;
    fVar198 = auVar96._8_4_;
    fVar199 = auVar96._12_4_;
    auVar96 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
    fVar227 = auVar96._0_4_;
    fVar229 = auVar96._4_4_;
    fVar251 = auVar96._8_4_;
    fVar180 = auVar96._12_4_;
    auVar96 = vshufps_avx(auVar246,auVar246,0);
    auVar189 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
    auVar176 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
    auVar222._0_4_ =
         ((auVar139._0_4_ * fVar227 + fVar196 * auVar127._0_4_) * fVar227 +
         fVar196 * (auVar127._0_4_ * fVar227 + fVar196 * auVar162._0_4_)) * 3.0;
    auVar222._4_4_ =
         ((auVar139._4_4_ * fVar229 + fVar197 * auVar127._4_4_) * fVar229 +
         fVar197 * (auVar127._4_4_ * fVar229 + fVar197 * auVar162._4_4_)) * 3.0;
    auVar222._8_4_ =
         ((auVar139._8_4_ * fVar251 + fVar198 * auVar127._8_4_) * fVar251 +
         fVar198 * (auVar127._8_4_ * fVar251 + fVar198 * auVar162._8_4_)) * 3.0;
    auVar222._12_4_ =
         ((auVar139._12_4_ * fVar180 + fVar199 * auVar127._12_4_) * fVar180 +
         fVar199 * (auVar127._12_4_ * fVar180 + fVar199 * auVar162._12_4_)) * 3.0;
    auVar139 = vshufps_avx(ZEXT416((uint)fVar249),ZEXT416((uint)fVar249),0);
    auVar142._0_4_ =
         auVar139._0_4_ * (float)local_238._0_4_ +
         auVar176._0_4_ * (float)local_248._0_4_ +
         auVar96._0_4_ * (float)local_268._0_4_ + auVar189._0_4_ * (float)local_258._0_4_;
    auVar142._4_4_ =
         auVar139._4_4_ * (float)local_238._4_4_ +
         auVar176._4_4_ * (float)local_248._4_4_ +
         auVar96._4_4_ * (float)local_268._4_4_ + auVar189._4_4_ * (float)local_258._4_4_;
    auVar142._8_4_ =
         auVar139._8_4_ * fStack_230 +
         auVar176._8_4_ * fStack_240 + auVar96._8_4_ * fStack_260 + auVar189._8_4_ * fStack_250;
    auVar142._12_4_ =
         auVar139._12_4_ * fStack_22c +
         auVar176._12_4_ * fStack_23c + auVar96._12_4_ * fStack_25c + auVar189._12_4_ * fStack_24c;
    auVar96 = vshufps_avx(auVar222,auVar222,0xc9);
    auVar177._0_4_ = auVar142._0_4_ * auVar96._0_4_;
    auVar177._4_4_ = auVar142._4_4_ * auVar96._4_4_;
    auVar177._8_4_ = auVar142._8_4_ * auVar96._8_4_;
    auVar177._12_4_ = auVar142._12_4_ * auVar96._12_4_;
    auVar96 = vshufps_avx(auVar142,auVar142,0xc9);
    auVar143._0_4_ = auVar222._0_4_ * auVar96._0_4_;
    auVar143._4_4_ = auVar222._4_4_ * auVar96._4_4_;
    auVar143._8_4_ = auVar222._8_4_ * auVar96._8_4_;
    auVar143._12_4_ = auVar222._12_4_ * auVar96._12_4_;
    auVar189 = vsubps_avx(auVar143,auVar177);
    auVar96 = vshufps_avx(auVar189,auVar189,0xe9);
    local_298 = vmovlps_avx(auVar96);
    local_290 = auVar189._0_4_;
    local_28c = vmovlps_avx(auVar20);
    local_284 = (int)local_2e8;
    local_280 = (int)local_410;
    local_27c = context->user->instID[0];
    local_278 = context->user->instPrimID[0];
    ray->tfar = fVar200;
    local_49c = -1;
    local_2d8.valid = &local_49c;
    local_2d8.geometryUserPtr = pGVar13->userPtr;
    local_2d8.context = context->user;
    local_2d8.hit = (RTCHitN *)&local_298;
    local_2d8.N = 1;
    local_2d8.ray = (RTCRayN *)ray;
    if ((pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
       ((*pGVar13->occlusionFilterN)(&local_2d8), *local_2d8.valid != 0)) {
      p_Var18 = context->args->filter;
      if ((p_Var18 == (RTCFilterFunctionN)0x0) ||
         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
            RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar13->field_8).field_0x2 & 0x40) == 0)) ||
          ((*p_Var18)(&local_2d8), *local_2d8.valid != 0)))) {
        bVar71 = 1;
        goto LAB_008b75fe;
      }
    }
    ray->tfar = fVar231;
  }
  bVar71 = 0;
LAB_008b75fe:
  bVar75 = (bool)(bVar75 | bVar71);
  goto LAB_008b6737;
LAB_008b7617:
  auVar96 = vinsertps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar200),0x10);
  auVar359 = ZEXT1664(auVar96);
  auVar262 = ZEXT1664(local_478);
  auVar343 = ZEXT1664(local_318);
  auVar274 = ZEXT1664(local_328);
  auVar292 = ZEXT1664(local_338);
  auVar301 = ZEXT1664(local_348);
  auVar313 = ZEXT1664(local_358);
  auVar321 = ZEXT1664(local_368);
  auVar334 = ZEXT1664(auVar260);
  goto LAB_008b60dd;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }